

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_fma::forward
          (BinaryOp_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 (*pauVar1) [16];
  undefined4 uVar2;
  uint uVar3;
  pointer pMVar4;
  Mat *this_00;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  bool bVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  __m256 *pafVar27;
  int y;
  uint uVar28;
  long lVar29;
  int iVar30;
  Mat *pMVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  int z;
  int iVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [32];
  __m256 *pafVar38;
  float *pfVar39;
  uint uVar40;
  float *pfVar41;
  undefined1 (*pauVar42) [32];
  ulong uVar43;
  undefined4 *puVar44;
  undefined1 (*pauVar45) [32];
  undefined8 *puVar46;
  undefined1 (*pauVar47) [32];
  float *pfVar48;
  undefined1 (*pauVar49) [32];
  float fVar50;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar51;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar98;
  float fVar99;
  float fVar103;
  undefined8 uVar104;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined8 uVar105;
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  __m256 afVar78;
  undefined1 auVar102 [56];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar136 [64];
  __m128 afVar137;
  binary_op_ratan2 op;
  __m128 _b;
  binary_op_ratan2 op_4;
  __m256 _b_avx;
  Mat *local_170;
  float *local_168;
  Mat *local_160;
  binary_op_ratan2 local_141;
  undefined1 local_140 [16];
  float *local_128;
  void *local_120;
  float *local_118;
  ulong local_110;
  size_t local_108;
  __m256 local_100;
  binary_op_ratan2 local_d0 [8];
  float afStack_c8 [2];
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  undefined1 local_a0 [16];
  float afStack_90 [2];
  float afStack_88 [2];
  undefined1 local_80 [32];
  
  local_140._8_8_ = local_140._0_8_;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_160 = pMVar4 + 1;
  iVar30 = pMVar4[1].h * pMVar4[1].w * pMVar4[1].d * pMVar4[1].c * pMVar4[1].elempack;
  if (((pMVar4->dims < pMVar4[1].dims) && (iVar30 != 1)) ||
     (pMVar4->c * pMVar4->elempack * pMVar4->d * pMVar4->h * pMVar4->w < iVar30)) {
    uVar26 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_fma[-3]);
    switch(uVar26) {
    case 1:
      uVar26 = 7;
      break;
    case 3:
      uVar26 = 8;
      break;
    case 6:
      uVar26 = 9;
      break;
    case 7:
      uVar26 = 1;
      break;
    case 8:
      uVar26 = 3;
      break;
    case 9:
      uVar26 = 6;
      break;
    case 10:
      uVar26 = 0xb;
      break;
    case 0xb:
      uVar26 = 10;
    }
    local_170 = local_160;
    local_160 = pMVar4;
  }
  else {
    uVar26 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_fma[-3]);
    local_170 = pMVar4;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,local_170,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  iVar30 = local_160->elempack;
  uVar28 = local_160->w;
  local_140._0_8_ = ZEXT48(uVar28);
  iVar35 = local_160->h;
  iVar21 = local_160->d;
  iVar20 = iVar35 * uVar28 * iVar21;
  uVar40 = local_160->c;
  if (uVar40 * iVar30 * iVar20 != 1) {
    uVar24 = local_170->dims;
    uVar3 = local_160->dims;
    if ((((uVar24 != uVar3) || (local_170->w != uVar28)) ||
        ((local_170->h != iVar35 || ((local_170->d != iVar21 || (local_170->c != uVar40)))))) ||
       (local_170->elempack != iVar30)) {
      if ((int)uVar3 < (int)uVar24) {
LAB_0035d05e:
        binary_op_broadcast_inner(local_170,local_160,this_00,uVar26,(Option *)(ulong)uVar3);
        goto switchD_0035cf79_default;
      }
      if (uVar24 == 2) {
        if ((uVar28 == 1) && (iVar35 == local_170->h)) goto LAB_0035d05e;
LAB_0035d0ee:
        bVar19 = false;
LAB_0035d0f1:
        bVar18 = false;
      }
      else {
        if (uVar24 == 4) {
          bVar19 = true;
          if ((uVar28 == 1) &&
             (((iVar35 == 1 &&
               (((iVar21 == 1 && (uVar40 == local_170->c)) ||
                ((iVar21 == local_170->d && (uVar40 == local_170->c)))))) ||
              (((iVar35 == local_170->h && (iVar21 == local_170->d)) && (uVar40 == local_170->c)))))
             ) goto LAB_0035d05e;
          goto LAB_0035d0f1;
        }
        if (uVar24 != 3) goto LAB_0035d0ee;
        bVar18 = true;
        if ((uVar28 == 1) &&
           (((iVar35 == 1 && (uVar40 == local_170->c)) ||
            ((iVar35 == local_170->h && (uVar40 == local_170->c)))))) goto LAB_0035d05e;
        bVar19 = false;
      }
      if ((iVar30 == 1) &&
         (((((uVar24 == 2 && (iVar35 == 1)) && (uVar28 == local_170->w)) ||
           ((bVar18 &&
            ((((uVar40 == 1 && (iVar35 == 1)) && (uVar28 == local_170->w)) ||
             (((uVar28 == local_170->w && (uVar40 == 1)) && (iVar35 == local_170->h)))))))) ||
          ((bVar19 &&
           (((((uVar40 == 1 && (iVar21 == 1)) && (iVar35 == 1)) && (uVar28 == local_170->w)) ||
            ((uVar28 == local_170->w &&
             ((((uVar40 == 1 && (iVar21 == 1)) && (iVar35 == local_170->h)) ||
              (((iVar35 == local_170->h && (uVar40 == 1)) && (iVar21 == local_170->d)))))))))))))) {
        switch(uVar26) {
        case 0:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pfVar39 = (float *)((long)local_170->w * uVar25 * local_170->elemsize +
                                 (long)local_170->data);
              pauVar42 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  fVar51 = *pfVar41;
                  auVar76._0_4_ = fVar51 + *pfVar39;
                  auVar76._4_4_ = fVar51 + pfVar39[1];
                  auVar76._8_4_ = fVar51 + pfVar39[2];
                  auVar76._12_4_ = fVar51 + pfVar39[3];
                  auVar76._16_4_ = fVar51 + pfVar39[4];
                  auVar76._20_4_ = fVar51 + pfVar39[5];
                  auVar76._24_4_ = fVar51 + pfVar39[6];
                  auVar76._28_4_ = fVar51 + pfVar39[7];
                  *pauVar42 = auVar76;
                  pfVar39 = pfVar39 + 8;
                  pfVar41 = pfVar41 + 1;
                  pauVar42 = pauVar42 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  fVar51 = *pfVar41;
                  auVar53._0_4_ = fVar51 + *pfVar39;
                  auVar53._4_4_ = fVar51 + pfVar39[1];
                  auVar53._8_4_ = fVar51 + pfVar39[2];
                  auVar53._12_4_ = fVar51 + pfVar39[3];
                  *(undefined1 (*) [16])*pauVar42 = auVar53;
                  pfVar39 = pfVar39 + 4;
                  pfVar41 = pfVar41 + 1;
                  pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  *(float *)((long)*pauVar42 + lVar29 * 4) = pfVar41[lVar29] + pfVar39[lVar29];
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            pauVar42 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar39 = (float *)((long)local_160->data +
                                   (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29
                                   );
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    fVar51 = *pfVar39;
                    auVar84._0_4_ = fVar51 + *pfVar41;
                    auVar84._4_4_ = fVar51 + pfVar41[1];
                    auVar84._8_4_ = fVar51 + pfVar41[2];
                    auVar84._12_4_ = fVar51 + pfVar41[3];
                    auVar84._16_4_ = fVar51 + pfVar41[4];
                    auVar84._20_4_ = fVar51 + pfVar41[5];
                    auVar84._24_4_ = fVar51 + pfVar41[6];
                    auVar84._28_4_ = fVar51 + pfVar41[7];
                    *pauVar42 = auVar84;
                    pfVar41 = pfVar41 + 8;
                    pfVar39 = pfVar39 + 1;
                    pauVar42 = pauVar42 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    fVar51 = *pfVar39;
                    auVar69._0_4_ = fVar51 + *pfVar41;
                    auVar69._4_4_ = fVar51 + pfVar41[1];
                    auVar69._8_4_ = fVar51 + pfVar41[2];
                    auVar69._12_4_ = fVar51 + pfVar41[3];
                    *(undefined1 (*) [16])*pauVar42 = auVar69;
                    pfVar41 = pfVar41 + 4;
                    pfVar39 = pfVar39 + 1;
                    pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    *(float *)((long)*pauVar42 + lVar29 * 4) = pfVar39[lVar29] + pfVar41[lVar29];
                    lVar22 = lVar22 + -4;
                  }
                  pfVar41 = (float *)((long)pfVar41 - lVar22);
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                }
              }
            }
          }
          return 0;
        case 1:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pauVar42 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar25 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              puVar44 = (undefined4 *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar115._4_4_ = uVar2;
                  auVar115._0_4_ = uVar2;
                  auVar115._8_4_ = uVar2;
                  auVar115._12_4_ = uVar2;
                  auVar115._16_4_ = uVar2;
                  auVar115._20_4_ = uVar2;
                  auVar115._24_4_ = uVar2;
                  auVar115._28_4_ = uVar2;
                  auVar12 = vsubps_avx(*pauVar42,auVar115);
                  *pauVar47 = auVar12;
                  pauVar42 = pauVar42 + 1;
                  puVar44 = puVar44 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar107._4_4_ = uVar2;
                  auVar107._0_4_ = uVar2;
                  auVar107._8_4_ = uVar2;
                  auVar107._12_4_ = uVar2;
                  auVar74 = vsubps_avx(*(undefined1 (*) [16])*pauVar42,auVar107);
                  *(undefined1 (*) [16])*pauVar47 = auVar74;
                  pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                  puVar44 = puVar44 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  *(float *)((long)*pauVar47 + lVar29 * 4) =
                       *(float *)(*pauVar42 + lVar29 * 4) - (float)puVar44[lVar29];
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                puVar44 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29);
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar116._4_4_ = uVar2;
                    auVar116._0_4_ = uVar2;
                    auVar116._8_4_ = uVar2;
                    auVar116._12_4_ = uVar2;
                    auVar116._16_4_ = uVar2;
                    auVar116._20_4_ = uVar2;
                    auVar116._24_4_ = uVar2;
                    auVar116._28_4_ = uVar2;
                    auVar12 = vsubps_avx(*pauVar42,auVar116);
                    *pauVar47 = auVar12;
                    pauVar42 = pauVar42 + 1;
                    puVar44 = puVar44 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar109._4_4_ = uVar2;
                    auVar109._0_4_ = uVar2;
                    auVar109._8_4_ = uVar2;
                    auVar109._12_4_ = uVar2;
                    auVar74 = vsubps_avx(*(undefined1 (*) [16])*pauVar42,auVar109);
                    *(undefined1 (*) [16])*pauVar47 = auVar74;
                    pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                    puVar44 = puVar44 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    *(float *)((long)*pauVar47 + lVar29 * 4) =
                         *(float *)(*pauVar42 + lVar29 * 4) - (float)puVar44[lVar29];
                    lVar22 = lVar22 + -4;
                  }
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar22);
                }
              }
            }
          }
          return 0;
        case 2:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pfVar39 = (float *)((long)local_170->w * uVar25 * local_170->elemsize +
                                 (long)local_170->data);
              pauVar42 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  fVar51 = *pfVar41;
                  auVar13._4_4_ = fVar51 * pfVar39[1];
                  auVar13._0_4_ = fVar51 * *pfVar39;
                  auVar13._8_4_ = fVar51 * pfVar39[2];
                  auVar13._12_4_ = fVar51 * pfVar39[3];
                  auVar13._16_4_ = fVar51 * pfVar39[4];
                  auVar13._20_4_ = fVar51 * pfVar39[5];
                  auVar13._24_4_ = fVar51 * pfVar39[6];
                  auVar13._28_4_ = fVar51;
                  *pauVar42 = auVar13;
                  pfVar39 = pfVar39 + 8;
                  pfVar41 = pfVar41 + 1;
                  pauVar42 = pauVar42 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  fVar51 = *pfVar41;
                  auVar59._0_4_ = fVar51 * *pfVar39;
                  auVar59._4_4_ = fVar51 * pfVar39[1];
                  auVar59._8_4_ = fVar51 * pfVar39[2];
                  auVar59._12_4_ = fVar51 * pfVar39[3];
                  *(undefined1 (*) [16])*pauVar42 = auVar59;
                  pfVar39 = pfVar39 + 4;
                  pfVar41 = pfVar41 + 1;
                  pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  *(float *)((long)*pauVar42 + lVar29 * 4) = pfVar41[lVar29] * pfVar39[lVar29];
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            pauVar42 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar39 = (float *)((long)local_160->data +
                                   (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29
                                   );
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    fVar51 = *pfVar39;
                    auVar15._4_4_ = fVar51 * pfVar41[1];
                    auVar15._0_4_ = fVar51 * *pfVar41;
                    auVar15._8_4_ = fVar51 * pfVar41[2];
                    auVar15._12_4_ = fVar51 * pfVar41[3];
                    auVar15._16_4_ = fVar51 * pfVar41[4];
                    auVar15._20_4_ = fVar51 * pfVar41[5];
                    auVar15._24_4_ = fVar51 * pfVar41[6];
                    auVar15._28_4_ = fVar51;
                    *pauVar42 = auVar15;
                    pfVar41 = pfVar41 + 8;
                    pfVar39 = pfVar39 + 1;
                    pauVar42 = pauVar42 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    fVar51 = *pfVar39;
                    auVar67._0_4_ = fVar51 * *pfVar41;
                    auVar67._4_4_ = fVar51 * pfVar41[1];
                    auVar67._8_4_ = fVar51 * pfVar41[2];
                    auVar67._12_4_ = fVar51 * pfVar41[3];
                    *(undefined1 (*) [16])*pauVar42 = auVar67;
                    pfVar41 = pfVar41 + 4;
                    pfVar39 = pfVar39 + 1;
                    pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    *(float *)((long)*pauVar42 + lVar29 * 4) = pfVar39[lVar29] * pfVar41[lVar29];
                    lVar22 = lVar22 + -4;
                  }
                  pfVar41 = (float *)((long)pfVar41 - lVar22);
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                }
              }
            }
          }
          return 0;
        case 3:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pfVar39 = (float *)((long)local_170->w * uVar25 * local_170->elemsize +
                                 (long)local_170->data);
              pauVar42 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  auVar74 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar41)),
                                        ZEXT416((uint)(1.0 / *pfVar41)),0);
                  auVar14._4_4_ = auVar74._4_4_ * pfVar39[1];
                  auVar14._0_4_ = auVar74._0_4_ * *pfVar39;
                  auVar14._8_4_ = auVar74._8_4_ * pfVar39[2];
                  auVar14._12_4_ = auVar74._12_4_ * pfVar39[3];
                  auVar14._16_4_ = auVar74._0_4_ * pfVar39[4];
                  auVar14._20_4_ = auVar74._4_4_ * pfVar39[5];
                  auVar14._24_4_ = auVar74._8_4_ * pfVar39[6];
                  auVar14._28_4_ = auVar74._12_4_;
                  *pauVar42 = auVar14;
                  pfVar39 = pfVar39 + 8;
                  pfVar41 = pfVar41 + 1;
                  pauVar42 = pauVar42 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  auVar74 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar41)),
                                        ZEXT416((uint)(1.0 / *pfVar41)),0);
                  auVar106._0_4_ = auVar74._0_4_ * *pfVar39;
                  auVar106._4_4_ = auVar74._4_4_ * pfVar39[1];
                  auVar106._8_4_ = auVar74._8_4_ * pfVar39[2];
                  auVar106._12_4_ = auVar74._12_4_ * pfVar39[3];
                  *(undefined1 (*) [16])*pauVar42 = auVar106;
                  pfVar39 = pfVar39 + 4;
                  pfVar41 = pfVar41 + 1;
                  pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  *(float *)((long)*pauVar42 + lVar29 * 4) = pfVar39[lVar29] / pfVar41[lVar29];
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            pauVar42 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar39 = (float *)((long)local_160->data +
                                   (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29
                                   );
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    auVar74 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar39)),
                                          ZEXT416((uint)(1.0 / *pfVar39)),0);
                    auVar16._4_4_ = auVar74._4_4_ * pfVar41[1];
                    auVar16._0_4_ = auVar74._0_4_ * *pfVar41;
                    auVar16._8_4_ = auVar74._8_4_ * pfVar41[2];
                    auVar16._12_4_ = auVar74._12_4_ * pfVar41[3];
                    auVar16._16_4_ = auVar74._0_4_ * pfVar41[4];
                    auVar16._20_4_ = auVar74._4_4_ * pfVar41[5];
                    auVar16._24_4_ = auVar74._8_4_ * pfVar41[6];
                    auVar16._28_4_ = auVar74._12_4_;
                    *pauVar42 = auVar16;
                    pfVar41 = pfVar41 + 8;
                    pfVar39 = pfVar39 + 1;
                    pauVar42 = pauVar42 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    auVar74 = vshufps_avx(ZEXT416((uint)(1.0 / *pfVar39)),
                                          ZEXT416((uint)(1.0 / *pfVar39)),0);
                    auVar108._0_4_ = auVar74._0_4_ * *pfVar41;
                    auVar108._4_4_ = auVar74._4_4_ * pfVar41[1];
                    auVar108._8_4_ = auVar74._8_4_ * pfVar41[2];
                    auVar108._12_4_ = auVar74._12_4_ * pfVar41[3];
                    *(undefined1 (*) [16])*pauVar42 = auVar108;
                    pfVar41 = pfVar41 + 4;
                    pfVar39 = pfVar39 + 1;
                    pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    *(float *)((long)*pauVar42 + lVar29 * 4) = pfVar41[lVar29] / pfVar39[lVar29];
                    lVar22 = lVar22 + -4;
                  }
                  pfVar41 = (float *)((long)pfVar41 - lVar22);
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                }
              }
            }
          }
          return 0;
        case 4:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pauVar42 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar25 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              puVar44 = (undefined4 *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar79._4_4_ = uVar2;
                  auVar79._0_4_ = uVar2;
                  auVar79._8_4_ = uVar2;
                  auVar79._12_4_ = uVar2;
                  auVar79._16_4_ = uVar2;
                  auVar79._20_4_ = uVar2;
                  auVar79._24_4_ = uVar2;
                  auVar79._28_4_ = uVar2;
                  auVar12 = vmaxps_avx(auVar79,*pauVar42);
                  *pauVar47 = auVar12;
                  pauVar42 = pauVar42 + 1;
                  puVar44 = puVar44 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar57._4_4_ = uVar2;
                  auVar57._0_4_ = uVar2;
                  auVar57._8_4_ = uVar2;
                  auVar57._12_4_ = uVar2;
                  auVar74 = vmaxps_avx(auVar57,*(undefined1 (*) [16])*pauVar42);
                  *(undefined1 (*) [16])*pauVar47 = auVar74;
                  pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                  puVar44 = puVar44 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  auVar74 = vmaxss_avx(ZEXT416((uint)puVar44[lVar29]),
                                       ZEXT416(*(uint *)(*pauVar42 + lVar29 * 4)));
                  *(int *)((long)*pauVar47 + lVar29 * 4) = auVar74._0_4_;
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                puVar44 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29);
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar82._4_4_ = uVar2;
                    auVar82._0_4_ = uVar2;
                    auVar82._8_4_ = uVar2;
                    auVar82._12_4_ = uVar2;
                    auVar82._16_4_ = uVar2;
                    auVar82._20_4_ = uVar2;
                    auVar82._24_4_ = uVar2;
                    auVar82._28_4_ = uVar2;
                    auVar12 = vmaxps_avx(auVar82,*pauVar42);
                    *pauVar47 = auVar12;
                    pauVar42 = pauVar42 + 1;
                    puVar44 = puVar44 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar65._4_4_ = uVar2;
                    auVar65._0_4_ = uVar2;
                    auVar65._8_4_ = uVar2;
                    auVar65._12_4_ = uVar2;
                    auVar74 = vmaxps_avx(auVar65,*(undefined1 (*) [16])*pauVar42);
                    *(undefined1 (*) [16])*pauVar47 = auVar74;
                    pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                    puVar44 = puVar44 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    auVar74 = vmaxss_avx(ZEXT416((uint)puVar44[lVar29]),
                                         ZEXT416(*(uint *)(*pauVar42 + lVar29 * 4)));
                    *(int *)((long)*pauVar47 + lVar29 * 4) = auVar74._0_4_;
                    lVar22 = lVar22 + -4;
                  }
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar22);
                }
              }
            }
          }
          return 0;
        case 5:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pauVar42 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar25 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              puVar44 = (undefined4 *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar81._4_4_ = uVar2;
                  auVar81._0_4_ = uVar2;
                  auVar81._8_4_ = uVar2;
                  auVar81._12_4_ = uVar2;
                  auVar81._16_4_ = uVar2;
                  auVar81._20_4_ = uVar2;
                  auVar81._24_4_ = uVar2;
                  auVar81._28_4_ = uVar2;
                  auVar12 = vminps_avx(auVar81,*pauVar42);
                  *pauVar47 = auVar12;
                  pauVar42 = pauVar42 + 1;
                  puVar44 = puVar44 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar61._4_4_ = uVar2;
                  auVar61._0_4_ = uVar2;
                  auVar61._8_4_ = uVar2;
                  auVar61._12_4_ = uVar2;
                  auVar74 = vminps_avx(auVar61,*(undefined1 (*) [16])*pauVar42);
                  *(undefined1 (*) [16])*pauVar47 = auVar74;
                  pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                  puVar44 = puVar44 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  auVar74 = vminss_avx(ZEXT416((uint)puVar44[lVar29]),
                                       ZEXT416(*(uint *)(*pauVar42 + lVar29 * 4)));
                  *(int *)((long)*pauVar47 + lVar29 * 4) = auVar74._0_4_;
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                puVar44 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29);
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar85._4_4_ = uVar2;
                    auVar85._0_4_ = uVar2;
                    auVar85._8_4_ = uVar2;
                    auVar85._12_4_ = uVar2;
                    auVar85._16_4_ = uVar2;
                    auVar85._20_4_ = uVar2;
                    auVar85._24_4_ = uVar2;
                    auVar85._28_4_ = uVar2;
                    auVar12 = vminps_avx(auVar85,*pauVar42);
                    *pauVar47 = auVar12;
                    pauVar42 = pauVar42 + 1;
                    puVar44 = puVar44 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar70._4_4_ = uVar2;
                    auVar70._0_4_ = uVar2;
                    auVar70._8_4_ = uVar2;
                    auVar70._12_4_ = uVar2;
                    auVar74 = vminps_avx(auVar70,*(undefined1 (*) [16])*pauVar42);
                    *(undefined1 (*) [16])*pauVar47 = auVar74;
                    pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                    puVar44 = puVar44 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    auVar74 = vminss_avx(ZEXT416((uint)puVar44[lVar29]),
                                         ZEXT416(*(uint *)(*pauVar42 + lVar29 * 4)));
                    *(int *)((long)*pauVar47 + lVar29 * 4) = auVar74._0_4_;
                    lVar22 = lVar22 + -4;
                  }
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar22);
                }
              }
            }
          }
          return 0;
        case 6:
          iVar30 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            local_118 = (float *)0x0;
            if (0 < (int)(uint)local_120) {
              local_118 = (float *)(ulong)(uint)local_120;
            }
            while ((float *)uVar25 != local_118) {
              pfVar48 = (float *)((long)local_170->w * uVar25 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar39 = (float *)((long)this_00->w * uVar25 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              uVar33 = uVar36;
              local_128 = (float *)uVar25;
              if (iVar30 == 8) {
                while ((int)uVar33 != 0) {
                  local_c0 = *(float (*) [2])pfVar48;
                  afStack_b8 = *(float (*) [2])(pfVar48 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar48 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar48 + 6);
                  fVar51 = *pfVar41;
                  local_100[1] = fVar51;
                  local_100[0] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  local_100[4] = fVar51;
                  local_100[5] = fVar51;
                  local_100[6] = fVar51;
                  local_100[7] = fVar51;
                  afVar78 = local_100;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            ((binary_op_pow *)local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar39 = afVar78;
                  pfVar48 = pfVar48 + 8;
                  pfVar41 = pfVar41 + 1;
                  pfVar39 = pfVar39 + 8;
                  uVar33 = (ulong)((int)uVar33 - 1);
                }
              }
              uVar25 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar25 != 0) {
                  local_c0 = *(float (*) [2])pfVar48;
                  afStack_b8 = *(float (*) [2])(pfVar48 + 2);
                  fVar51 = *pfVar41;
                  auVar62._4_4_ = fVar51;
                  auVar62._0_4_ = fVar51;
                  auVar62._8_4_ = fVar51;
                  auVar62._12_4_ = fVar51;
                  local_100[0] = fVar51;
                  local_100[1] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  auVar102 = ZEXT856(auVar62._8_8_);
                  afVar137 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                       ((binary_op_pow *)local_d0,(__m128 *)local_c0,
                                        (__m128 *)local_100);
                  auVar88._0_8_ = afVar137._0_8_;
                  auVar88._8_56_ = auVar102;
                  *(undefined1 (*) [16])pfVar39 = auVar88._0_16_;
                  pfVar48 = pfVar48 + 4;
                  pfVar41 = pfVar41 + 1;
                  pfVar39 = pfVar39 + 4;
                  uVar25 = (ulong)((int)uVar25 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  fVar51 = powf(pfVar48[lVar29],pfVar41[lVar29]);
                  (*(__m256 *)pfVar39)[lVar29] = fVar51;
                }
              }
              uVar25 = (long)local_128 + 1;
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          uVar25 = 0;
          uVar36 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar36 = uVar25;
          }
          local_140._0_8_ = uVar36;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar36 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar36 = 0;
          }
          local_a0._0_8_ = uVar36;
          while (uVar25 != local_a0._0_8_) {
            pfVar39 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar25;
            pfVar41 = (float *)(this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            iVar35 = 0;
            while (iVar35 != (uint)local_110) {
              iVar21 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar35);
              if (iVar35 <= iVar21) {
                iVar21 = iVar35;
              }
              local_118 = (float *)(long)iVar21;
              iVar35 = 0;
              while (iVar35 != (uint)local_120) {
                iVar21 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar35);
                if (iVar35 <= iVar21) {
                  iVar21 = iVar35;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar48 = (float *)((long)local_160->data +
                                   iVar21 * lVar29 + (long)local_160->h * (long)local_118 * lVar29);
                if (iVar30 == 8) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar39;
                    afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar39 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar39 + 6);
                    fVar51 = *pfVar48;
                    local_100[1] = fVar51;
                    local_100[0] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    local_100[4] = fVar51;
                    local_100[5] = fVar51;
                    local_100[6] = fVar51;
                    local_100[7] = fVar51;
                    afVar78 = local_100;
                    BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                              ((binary_op_pow *)local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar41 = afVar78;
                    pfVar39 = pfVar39 + 8;
                    pfVar48 = pfVar48 + 1;
                    pfVar41 = pfVar41 + 8;
                  }
                }
                if (iVar30 == 4) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar39;
                    afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                    fVar51 = *pfVar48;
                    auVar71._4_4_ = fVar51;
                    auVar71._0_4_ = fVar51;
                    auVar71._8_4_ = fVar51;
                    auVar71._12_4_ = fVar51;
                    local_100[0] = fVar51;
                    local_100[1] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    auVar102 = ZEXT856(auVar71._8_8_);
                    afVar137 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         ((binary_op_pow *)local_d0,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar92._0_8_ = afVar137._0_8_;
                    auVar92._8_56_ = auVar102;
                    *(undefined1 (*) [16])pfVar41 = auVar92._0_16_;
                    pfVar39 = pfVar39 + 4;
                    pfVar48 = pfVar48 + 1;
                    pfVar41 = pfVar41 + 4;
                  }
                }
                if (iVar30 == 1) {
                  lVar29 = 0;
                  for (lVar22 = 0; local_140._0_4_ != (int)lVar22; lVar22 = lVar22 + 1) {
                    fVar51 = powf(pfVar39[lVar22],pfVar48[lVar22]);
                    pfVar41[lVar22] = fVar51;
                    lVar29 = lVar29 + -4;
                  }
                  pfVar39 = (float *)((long)pfVar39 - lVar29);
                  pfVar41 = (float *)((long)pfVar41 - lVar29);
                }
                iVar35 = (int)local_128 + 1;
              }
              iVar35 = (int)local_108 + 1;
            }
            uVar25 = local_80._0_8_ + 1;
          }
          return 0;
        case 7:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pauVar42 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar25 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              puVar44 = (undefined4 *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar80._4_4_ = uVar2;
                  auVar80._0_4_ = uVar2;
                  auVar80._8_4_ = uVar2;
                  auVar80._12_4_ = uVar2;
                  auVar80._16_4_ = uVar2;
                  auVar80._20_4_ = uVar2;
                  auVar80._24_4_ = uVar2;
                  auVar80._28_4_ = uVar2;
                  auVar12 = vsubps_avx(auVar80,*pauVar42);
                  *pauVar47 = auVar12;
                  pauVar42 = pauVar42 + 1;
                  puVar44 = puVar44 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  uVar2 = *puVar44;
                  auVar60._4_4_ = uVar2;
                  auVar60._0_4_ = uVar2;
                  auVar60._8_4_ = uVar2;
                  auVar60._12_4_ = uVar2;
                  auVar74 = vsubps_avx(auVar60,*(undefined1 (*) [16])*pauVar42);
                  *(undefined1 (*) [16])*pauVar47 = auVar74;
                  pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                  puVar44 = puVar44 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  *(float *)((long)*pauVar47 + lVar29 * 4) =
                       (float)puVar44[lVar29] - *(float *)(*pauVar42 + lVar29 * 4);
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                puVar44 = (undefined4 *)
                          ((long)local_160->data +
                          (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29);
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar83._4_4_ = uVar2;
                    auVar83._0_4_ = uVar2;
                    auVar83._8_4_ = uVar2;
                    auVar83._12_4_ = uVar2;
                    auVar83._16_4_ = uVar2;
                    auVar83._20_4_ = uVar2;
                    auVar83._24_4_ = uVar2;
                    auVar83._28_4_ = uVar2;
                    auVar12 = vsubps_avx(auVar83,*pauVar42);
                    *pauVar47 = auVar12;
                    pauVar42 = pauVar42 + 1;
                    puVar44 = puVar44 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    uVar2 = *puVar44;
                    auVar68._4_4_ = uVar2;
                    auVar68._0_4_ = uVar2;
                    auVar68._8_4_ = uVar2;
                    auVar68._12_4_ = uVar2;
                    auVar74 = vsubps_avx(auVar68,*(undefined1 (*) [16])*pauVar42);
                    *(undefined1 (*) [16])*pauVar47 = auVar74;
                    pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                    puVar44 = puVar44 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    *(float *)((long)*pauVar47 + lVar29 * 4) =
                         (float)puVar44[lVar29] - *(float *)(*pauVar42 + lVar29 * 4);
                    lVar22 = lVar22 + -4;
                  }
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar22);
                }
              }
            }
          }
          return 0;
        case 8:
          iVar30 = local_170->elempack;
          uVar26 = local_170->h;
          iVar35 = local_170->d;
          uVar40 = local_170->c;
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            uVar33 = 0;
            if (0 < (int)uVar26) {
              uVar33 = (ulong)uVar26;
            }
            for (; uVar25 != uVar33; uVar25 = uVar25 + 1) {
              pauVar42 = (undefined1 (*) [32])
                         ((long)local_170->w * uVar25 * local_170->elemsize + (long)local_170->data)
              ;
              pauVar47 = (undefined1 (*) [32])
                         ((long)this_00->w * uVar25 * this_00->elemsize + (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              uVar43 = uVar36;
              if (iVar30 == 8) {
                while ((int)uVar43 != 0) {
                  auVar12 = vrcpps_avx(*pauVar42);
                  fVar51 = *pfVar41;
                  auVar122._4_4_ = fVar51;
                  auVar122._0_4_ = fVar51;
                  auVar122._8_4_ = fVar51;
                  auVar122._12_4_ = fVar51;
                  auVar122._16_4_ = fVar51;
                  auVar122._20_4_ = fVar51;
                  auVar122._24_4_ = fVar51;
                  auVar122._28_4_ = fVar51;
                  auVar131._0_4_ = fVar51 * auVar12._0_4_;
                  auVar131._4_4_ = fVar51 * auVar12._4_4_;
                  auVar131._8_4_ = fVar51 * auVar12._8_4_;
                  auVar131._12_4_ = fVar51 * auVar12._12_4_;
                  auVar131._16_4_ = fVar51 * auVar12._16_4_;
                  auVar131._20_4_ = fVar51 * auVar12._20_4_;
                  auVar131._28_36_ = in_ZMM3._28_36_;
                  auVar131._24_4_ = fVar51 * auVar12._24_4_;
                  auVar75 = auVar131._0_32_;
                  in_ZMM3 = ZEXT3264(auVar75);
                  auVar74 = vfmsub213ps_fma(*pauVar42,auVar75,auVar122);
                  auVar74 = vfnmadd213ps_fma(ZEXT1632(auVar74),auVar12,auVar75);
                  *pauVar47 = ZEXT1632(auVar74);
                  pauVar42 = pauVar42 + 1;
                  pfVar41 = pfVar41 + 1;
                  pauVar47 = pauVar47 + 1;
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              uVar43 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar43 != 0) {
                  auVar74 = vrcpps_avx(*(undefined1 (*) [16])*pauVar42);
                  fVar51 = *pfVar41;
                  auVar119._4_4_ = fVar51;
                  auVar119._0_4_ = fVar51;
                  auVar119._8_4_ = fVar51;
                  auVar119._12_4_ = fVar51;
                  auVar126._0_4_ = fVar51 * auVar74._0_4_;
                  auVar126._4_4_ = fVar51 * auVar74._4_4_;
                  auVar126._8_4_ = fVar51 * auVar74._8_4_;
                  auVar126._12_4_ = fVar51 * auVar74._12_4_;
                  in_ZMM3 = ZEXT1664(auVar126);
                  auVar52 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar42,auVar126,auVar119);
                  auVar74 = vfnmadd213ps_fma(auVar52,auVar74,auVar126);
                  *(undefined1 (*) [16])*pauVar47 = auVar74;
                  pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                  pfVar41 = pfVar41 + 1;
                  pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                  uVar43 = (ulong)((int)uVar43 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  *(float *)((long)*pauVar47 + lVar29 * 4) =
                       pfVar41[lVar29] / *(float *)(*pauVar42 + lVar29 * 4);
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          if ((int)uVar28 < 1) {
            local_140._0_8_ = 0;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar35; iVar21 = iVar21 + 1) {
              iVar20 = local_160->d + -1;
              if (iVar21 <= iVar20) {
                iVar20 = iVar21;
              }
              for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                uVar40 = local_160->h - 1;
                if ((int)uVar28 <= (int)uVar40) {
                  uVar40 = uVar28;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar41 = (float *)((long)local_160->data +
                                   (int)uVar40 * lVar29 + (long)local_160->h * (long)iVar20 * lVar29
                                   );
                uVar33 = local_140._0_8_;
                if (iVar30 == 8) {
                  while ((int)uVar33 != 0) {
                    auVar12 = vrcpps_avx(*pauVar42);
                    fVar51 = *pfVar41;
                    auVar123._4_4_ = fVar51;
                    auVar123._0_4_ = fVar51;
                    auVar123._8_4_ = fVar51;
                    auVar123._12_4_ = fVar51;
                    auVar123._16_4_ = fVar51;
                    auVar123._20_4_ = fVar51;
                    auVar123._24_4_ = fVar51;
                    auVar123._28_4_ = fVar51;
                    auVar132._0_4_ = fVar51 * auVar12._0_4_;
                    auVar132._4_4_ = fVar51 * auVar12._4_4_;
                    auVar132._8_4_ = fVar51 * auVar12._8_4_;
                    auVar132._12_4_ = fVar51 * auVar12._12_4_;
                    auVar132._16_4_ = fVar51 * auVar12._16_4_;
                    auVar132._20_4_ = fVar51 * auVar12._20_4_;
                    auVar132._28_36_ = in_ZMM3._28_36_;
                    auVar132._24_4_ = fVar51 * auVar12._24_4_;
                    auVar75 = auVar132._0_32_;
                    in_ZMM3 = ZEXT3264(auVar75);
                    auVar74 = vfmsub213ps_fma(*pauVar42,auVar75,auVar123);
                    auVar74 = vfnmadd213ps_fma(ZEXT1632(auVar74),auVar12,auVar75);
                    *pauVar47 = ZEXT1632(auVar74);
                    pauVar42 = pauVar42 + 1;
                    pfVar41 = pfVar41 + 1;
                    pauVar47 = pauVar47 + 1;
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                uVar33 = local_140._0_8_;
                if (iVar30 == 4) {
                  while ((int)uVar33 != 0) {
                    auVar74 = vrcpps_avx(*(undefined1 (*) [16])*pauVar42);
                    fVar51 = *pfVar41;
                    auVar120._4_4_ = fVar51;
                    auVar120._0_4_ = fVar51;
                    auVar120._8_4_ = fVar51;
                    auVar120._12_4_ = fVar51;
                    auVar127._0_4_ = fVar51 * auVar74._0_4_;
                    auVar127._4_4_ = fVar51 * auVar74._4_4_;
                    auVar127._8_4_ = fVar51 * auVar74._8_4_;
                    auVar127._12_4_ = fVar51 * auVar74._12_4_;
                    in_ZMM3 = ZEXT1664(auVar127);
                    auVar52 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar42,auVar127,auVar120);
                    auVar74 = vfnmadd213ps_fma(auVar52,auVar74,auVar127);
                    *(undefined1 (*) [16])*pauVar47 = auVar74;
                    pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
                    pfVar41 = pfVar41 + 1;
                    pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
                    uVar33 = (ulong)((int)uVar33 - 1);
                  }
                }
                if (iVar30 == 1) {
                  lVar22 = 0;
                  for (lVar29 = 0; (int)local_140._0_8_ != (int)lVar29; lVar29 = lVar29 + 1) {
                    *(float *)((long)*pauVar47 + lVar29 * 4) =
                         pfVar41[lVar29] / *(float *)(*pauVar42 + lVar29 * 4);
                    lVar22 = lVar22 + -4;
                  }
                  pauVar42 = (undefined1 (*) [32])((long)pauVar42 - lVar22);
                  pauVar47 = (undefined1 (*) [32])((long)pauVar47 - lVar22);
                }
              }
            }
          }
          return 0;
        case 9:
          iVar30 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar24 == 2) {
            uVar25 = 0;
            uVar36 = 0;
            if (0 < (int)uVar28) {
              uVar36 = local_140._0_8_;
            }
            local_118 = (float *)0x0;
            if (0 < (int)(uint)local_120) {
              local_118 = (float *)(ulong)(uint)local_120;
            }
            while ((float *)uVar25 != local_118) {
              pfVar48 = (float *)((long)local_170->w * uVar25 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar39 = (float *)((long)this_00->w * uVar25 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              uVar33 = uVar36;
              local_128 = (float *)uVar25;
              if (iVar30 == 8) {
                while ((int)uVar33 != 0) {
                  local_c0 = *(float (*) [2])pfVar48;
                  afStack_b8 = *(float (*) [2])(pfVar48 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar48 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar48 + 6);
                  fVar51 = *pfVar41;
                  local_100[1] = fVar51;
                  local_100[0] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  local_100[4] = fVar51;
                  local_100[5] = fVar51;
                  local_100[6] = fVar51;
                  local_100[7] = fVar51;
                  afVar78 = local_100;
                  BinaryOp_x86_fma_functor::binary_op_rpow::func_pack8
                            ((binary_op_rpow *)local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar39 = afVar78;
                  pfVar48 = pfVar48 + 8;
                  pfVar41 = pfVar41 + 1;
                  pfVar39 = pfVar39 + 8;
                  uVar33 = (ulong)((int)uVar33 - 1);
                }
              }
              uVar25 = uVar36;
              if (iVar30 == 4) {
                while ((int)uVar25 != 0) {
                  local_c0 = *(float (*) [2])pfVar48;
                  afStack_b8 = *(float (*) [2])(pfVar48 + 2);
                  fVar51 = *pfVar41;
                  auVar58._4_4_ = fVar51;
                  auVar58._0_4_ = fVar51;
                  auVar58._8_4_ = fVar51;
                  auVar58._12_4_ = fVar51;
                  local_100[0] = fVar51;
                  local_100[1] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  auVar102 = ZEXT856(auVar58._8_8_);
                  afVar137 = BinaryOp_x86_fma_functor::binary_op_rpow::func_pack4
                                       ((binary_op_rpow *)local_d0,(__m128 *)local_c0,
                                        (__m128 *)local_100);
                  auVar87._0_8_ = afVar137._0_8_;
                  auVar87._8_56_ = auVar102;
                  *(undefined1 (*) [16])pfVar39 = auVar87._0_16_;
                  pfVar48 = pfVar48 + 4;
                  pfVar41 = pfVar41 + 1;
                  pfVar39 = pfVar39 + 4;
                  uVar25 = (ulong)((int)uVar25 - 1);
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)uVar36 != (int)lVar29; lVar29 = lVar29 + 1) {
                  fVar51 = powf(pfVar41[lVar29],pfVar48[lVar29]);
                  (*(__m256 *)pfVar39)[lVar29] = fVar51;
                }
              }
              uVar25 = (long)local_128 + 1;
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          uVar25 = 0;
          uVar36 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar36 = uVar25;
          }
          local_140._0_8_ = uVar36;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar36 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar36 = 0;
          }
          local_a0._0_8_ = uVar36;
          while (uVar25 != local_a0._0_8_) {
            pfVar39 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar25;
            pfVar41 = (float *)(this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            iVar35 = 0;
            while (iVar35 != (uint)local_110) {
              iVar21 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar35);
              if (iVar35 <= iVar21) {
                iVar21 = iVar35;
              }
              local_118 = (float *)(long)iVar21;
              iVar35 = 0;
              while (iVar35 != (uint)local_120) {
                iVar21 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar35);
                if (iVar35 <= iVar21) {
                  iVar21 = iVar35;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar48 = (float *)((long)local_160->data +
                                   iVar21 * lVar29 + (long)local_160->h * (long)local_118 * lVar29);
                if (iVar30 == 8) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar39;
                    afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar39 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar39 + 6);
                    fVar51 = *pfVar48;
                    local_100[1] = fVar51;
                    local_100[0] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    local_100[4] = fVar51;
                    local_100[5] = fVar51;
                    local_100[6] = fVar51;
                    local_100[7] = fVar51;
                    afVar78 = local_100;
                    BinaryOp_x86_fma_functor::binary_op_rpow::func_pack8
                              ((binary_op_rpow *)local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar41 = afVar78;
                    pfVar39 = pfVar39 + 8;
                    pfVar48 = pfVar48 + 1;
                    pfVar41 = pfVar41 + 8;
                  }
                }
                if (iVar30 == 4) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar39;
                    afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                    fVar51 = *pfVar48;
                    auVar66._4_4_ = fVar51;
                    auVar66._0_4_ = fVar51;
                    auVar66._8_4_ = fVar51;
                    auVar66._12_4_ = fVar51;
                    local_100[0] = fVar51;
                    local_100[1] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    auVar102 = ZEXT856(auVar66._8_8_);
                    afVar137 = BinaryOp_x86_fma_functor::binary_op_rpow::func_pack4
                                         ((binary_op_rpow *)local_d0,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar91._0_8_ = afVar137._0_8_;
                    auVar91._8_56_ = auVar102;
                    *(undefined1 (*) [16])pfVar41 = auVar91._0_16_;
                    pfVar39 = pfVar39 + 4;
                    pfVar48 = pfVar48 + 1;
                    pfVar41 = pfVar41 + 4;
                  }
                }
                if (iVar30 == 1) {
                  lVar29 = 0;
                  for (lVar22 = 0; local_140._0_4_ != (int)lVar22; lVar22 = lVar22 + 1) {
                    fVar51 = powf(pfVar48[lVar22],pfVar39[lVar22]);
                    pfVar41[lVar22] = fVar51;
                    lVar29 = lVar29 + -4;
                  }
                  pfVar39 = (float *)((long)pfVar39 - lVar29);
                  pfVar41 = (float *)((long)pfVar41 - lVar29);
                }
                iVar35 = (int)local_128 + 1;
              }
              iVar35 = (int)local_108 + 1;
            }
            uVar25 = local_80._0_8_ + 1;
          }
          return 0;
        case 10:
          iVar30 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar24 == 2) {
            local_118 = (float *)0x0;
            local_128 = (float *)0;
            if (0 < (int)uVar28) {
              local_128 = (float *)local_140._0_8_;
            }
            local_108 = 0;
            if (0 < (int)(uint)local_120) {
              local_108 = (size_t)(uint)local_120;
            }
            for (; local_118 != (float *)local_108; local_118 = (float *)((long)local_118 + 1)) {
              pfVar39 = (float *)((long)local_170->w * (long)local_118 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar48 = (float *)((long)this_00->w * (long)local_118 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              if (iVar30 == 8) {
                uVar36 = (ulong)local_128 & 0xffffffff;
                while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                  local_c0 = *(float (*) [2])pfVar39;
                  afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar39 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar39 + 6);
                  fVar51 = *pfVar41;
                  local_100[1] = fVar51;
                  local_100[0] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  local_100[4] = fVar51;
                  local_100[5] = fVar51;
                  local_100[6] = fVar51;
                  local_100[7] = fVar51;
                  afVar78 = local_100;
                  BinaryOp_x86_fma_functor::binary_op_atan2::func_pack8
                            ((binary_op_atan2 *)local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar48 = afVar78;
                  pfVar39 = pfVar39 + 8;
                  pfVar41 = pfVar41 + 1;
                  pfVar48 = pfVar48 + 8;
                }
              }
              if (iVar30 == 4) {
                uVar36 = (ulong)local_128 & 0xffffffff;
                while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                  local_c0 = *(float (*) [2])pfVar39;
                  afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                  fVar51 = *pfVar41;
                  auVar63._4_4_ = fVar51;
                  auVar63._0_4_ = fVar51;
                  auVar63._8_4_ = fVar51;
                  auVar63._12_4_ = fVar51;
                  local_100[0] = fVar51;
                  local_100[1] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  auVar102 = ZEXT856(auVar63._8_8_);
                  afVar137 = BinaryOp_x86_fma_functor::binary_op_atan2::func_pack4
                                       ((binary_op_atan2 *)local_d0,(__m128 *)local_c0,
                                        (__m128 *)local_100);
                  auVar89._0_8_ = afVar137._0_8_;
                  auVar89._8_56_ = auVar102;
                  *(undefined1 (*) [16])pfVar48 = auVar89._0_16_;
                  pfVar39 = pfVar39 + 4;
                  pfVar41 = pfVar41 + 1;
                  pfVar48 = pfVar48 + 4;
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)local_128 != (int)lVar29; lVar29 = lVar29 + 1) {
                  fVar51 = BinaryOp_x86_fma_functor::binary_op_atan2::func
                                     ((binary_op_atan2 *)local_d0,pfVar39,pfVar41);
                  (*(__m256 *)pfVar48)[lVar29] = fVar51;
                  pfVar39 = pfVar39 + 1;
                  pfVar41 = pfVar41 + 1;
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          uVar25 = 0;
          uVar36 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar36 = uVar25;
          }
          local_140._0_8_ = uVar36;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar36 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar36 = 0;
          }
          local_a0._0_8_ = uVar36;
          while (uVar25 != local_a0._0_8_) {
            pfVar41 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar25;
            pfVar39 = (float *)(this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            iVar35 = 0;
            while (iVar35 != (uint)local_110) {
              iVar21 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar35);
              if (iVar35 <= iVar21) {
                iVar21 = iVar35;
              }
              local_118 = (float *)(long)iVar21;
              iVar35 = 0;
              while (iVar35 != (uint)local_120) {
                iVar21 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar35);
                if (iVar35 <= iVar21) {
                  iVar21 = iVar35;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar48 = (float *)((long)local_160->data +
                                   iVar21 * lVar29 + (long)local_160->h * (long)local_118 * lVar29);
                if (iVar30 == 8) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar41;
                    afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar41 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar41 + 6);
                    fVar51 = *pfVar48;
                    local_100[1] = fVar51;
                    local_100[0] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    local_100[4] = fVar51;
                    local_100[5] = fVar51;
                    local_100[6] = fVar51;
                    local_100[7] = fVar51;
                    afVar78 = local_100;
                    BinaryOp_x86_fma_functor::binary_op_atan2::func_pack8
                              ((binary_op_atan2 *)local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar39 = afVar78;
                    pfVar41 = pfVar41 + 8;
                    pfVar48 = pfVar48 + 1;
                    pfVar39 = pfVar39 + 8;
                  }
                }
                if (iVar30 == 4) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar41;
                    afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                    fVar51 = *pfVar48;
                    auVar72._4_4_ = fVar51;
                    auVar72._0_4_ = fVar51;
                    auVar72._8_4_ = fVar51;
                    auVar72._12_4_ = fVar51;
                    local_100[0] = fVar51;
                    local_100[1] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    auVar102 = ZEXT856(auVar72._8_8_);
                    afVar137 = BinaryOp_x86_fma_functor::binary_op_atan2::func_pack4
                                         ((binary_op_atan2 *)local_d0,(__m128 *)local_c0,
                                          (__m128 *)local_100);
                    auVar93._0_8_ = afVar137._0_8_;
                    auVar93._8_56_ = auVar102;
                    *(undefined1 (*) [16])pfVar39 = auVar93._0_16_;
                    pfVar41 = pfVar41 + 4;
                    pfVar48 = pfVar48 + 1;
                    pfVar39 = pfVar39 + 4;
                  }
                }
                if (iVar30 == 1) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    fVar51 = BinaryOp_x86_fma_functor::binary_op_atan2::func
                                       ((binary_op_atan2 *)local_d0,pfVar41,pfVar48);
                    *pfVar39 = fVar51;
                    pfVar41 = pfVar41 + 1;
                    pfVar48 = pfVar48 + 1;
                    pfVar39 = pfVar39 + 1;
                  }
                }
                iVar35 = (int)local_128 + 1;
              }
              iVar35 = (int)local_108 + 1;
            }
            uVar25 = local_80._0_8_ + 1;
          }
          return 0;
        case 0xb:
          iVar30 = local_170->elempack;
          local_120._0_4_ = local_170->h;
          local_110._0_4_ = local_170->d;
          local_a0._0_8_ = ZEXT48((uint)local_170->c);
          if (uVar24 == 2) {
            local_118 = (float *)0x0;
            local_128 = (float *)0;
            if (0 < (int)uVar28) {
              local_128 = (float *)local_140._0_8_;
            }
            local_108 = 0;
            if (0 < (int)(uint)local_120) {
              local_108 = (size_t)(uint)local_120;
            }
            for (; local_118 != (float *)local_108; local_118 = (float *)((long)local_118 + 1)) {
              pfVar39 = (float *)((long)local_170->w * (long)local_118 * local_170->elemsize +
                                 (long)local_170->data);
              pfVar48 = (float *)((long)this_00->w * (long)local_118 * this_00->elemsize +
                                 (long)this_00->data);
              pfVar41 = (float *)local_160->data;
              if (iVar30 == 8) {
                uVar36 = (ulong)local_128 & 0xffffffff;
                while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                  local_c0 = *(float (*) [2])pfVar39;
                  afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                  afStack_b0 = *(float (*) [2])(pfVar39 + 4);
                  afStack_a8 = *(float (*) [2])(pfVar39 + 6);
                  fVar51 = *pfVar41;
                  local_100[1] = fVar51;
                  local_100[0] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  local_100[4] = fVar51;
                  local_100[5] = fVar51;
                  local_100[6] = fVar51;
                  local_100[7] = fVar51;
                  afVar78 = local_100;
                  BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack8
                            (local_d0,(__m256 *)local_c0,&local_100);
                  *(__m256 *)pfVar48 = afVar78;
                  pfVar39 = pfVar39 + 8;
                  pfVar41 = pfVar41 + 1;
                  pfVar48 = pfVar48 + 8;
                }
              }
              if (iVar30 == 4) {
                uVar36 = (ulong)local_128 & 0xffffffff;
                while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                  local_c0 = *(float (*) [2])pfVar39;
                  afStack_b8 = *(float (*) [2])(pfVar39 + 2);
                  fVar51 = *pfVar41;
                  auVar56._4_4_ = fVar51;
                  auVar56._0_4_ = fVar51;
                  auVar56._8_4_ = fVar51;
                  auVar56._12_4_ = fVar51;
                  local_100[0] = fVar51;
                  local_100[1] = fVar51;
                  local_100[2] = fVar51;
                  local_100[3] = fVar51;
                  auVar102 = ZEXT856(auVar56._8_8_);
                  afVar137 = BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack4
                                       (local_d0,(__m128 *)local_c0,(__m128 *)local_100);
                  auVar86._0_8_ = afVar137._0_8_;
                  auVar86._8_56_ = auVar102;
                  *(undefined1 (*) [16])pfVar48 = auVar86._0_16_;
                  pfVar39 = pfVar39 + 4;
                  pfVar41 = pfVar41 + 1;
                  pfVar48 = pfVar48 + 4;
                }
              }
              if (iVar30 == 1) {
                for (lVar29 = 0; (int)local_128 != (int)lVar29; lVar29 = lVar29 + 1) {
                  fVar51 = BinaryOp_x86_fma_functor::binary_op_ratan2::func
                                     (local_d0,pfVar39,pfVar41);
                  (*(__m256 *)pfVar48)[lVar29] = fVar51;
                  pfVar39 = pfVar39 + 1;
                  pfVar41 = pfVar41 + 1;
                }
              }
            }
            uVar24 = local_170->dims;
          }
          if (1 < uVar24 - 3) {
            return 0;
          }
          uVar25 = 0;
          uVar36 = local_140._0_8_ & 0xffffffff;
          if ((int)local_140._0_8_ < 1) {
            uVar36 = uVar25;
          }
          local_140._0_8_ = uVar36;
          if ((int)(uint)local_120 < 1) {
            local_120._0_4_ = 0;
          }
          if ((int)(uint)local_110 < 1) {
            local_110._0_4_ = 0;
          }
          uVar36 = local_a0._0_8_ & 0xffffffff;
          if ((int)local_a0._0_8_ < 1) {
            uVar36 = 0;
          }
          local_a0._0_8_ = uVar36;
          while (uVar25 != local_a0._0_8_) {
            pfVar41 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            local_80._0_8_ = uVar25;
            pfVar39 = (float *)(this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            iVar35 = 0;
            while (iVar35 != (uint)local_110) {
              iVar21 = local_160->d + -1;
              local_108 = CONCAT44(local_108._4_4_,iVar35);
              if (iVar35 <= iVar21) {
                iVar21 = iVar35;
              }
              local_118 = (float *)(long)iVar21;
              iVar35 = 0;
              while (iVar35 != (uint)local_120) {
                iVar21 = local_160->h + -1;
                local_128 = (float *)CONCAT44(local_128._4_4_,iVar35);
                if (iVar35 <= iVar21) {
                  iVar21 = iVar35;
                }
                lVar29 = (long)local_160->w * local_160->elemsize;
                pfVar48 = (float *)((long)local_160->data +
                                   iVar21 * lVar29 + (long)local_160->h * (long)local_118 * lVar29);
                if (iVar30 == 8) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar41;
                    afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                    afStack_b0 = *(float (*) [2])(pfVar41 + 4);
                    afStack_a8 = *(float (*) [2])(pfVar41 + 6);
                    fVar51 = *pfVar48;
                    local_100[1] = fVar51;
                    local_100[0] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    local_100[4] = fVar51;
                    local_100[5] = fVar51;
                    local_100[6] = fVar51;
                    local_100[7] = fVar51;
                    afVar78 = local_100;
                    BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack8
                              (local_d0,(__m256 *)local_c0,&local_100);
                    *(__m256 *)pfVar39 = afVar78;
                    pfVar41 = pfVar41 + 8;
                    pfVar48 = pfVar48 + 1;
                    pfVar39 = pfVar39 + 8;
                  }
                }
                if (iVar30 == 4) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    local_c0 = *(float (*) [2])pfVar41;
                    afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                    fVar51 = *pfVar48;
                    auVar64._4_4_ = fVar51;
                    auVar64._0_4_ = fVar51;
                    auVar64._8_4_ = fVar51;
                    auVar64._12_4_ = fVar51;
                    local_100[0] = fVar51;
                    local_100[1] = fVar51;
                    local_100[2] = fVar51;
                    local_100[3] = fVar51;
                    auVar102 = ZEXT856(auVar64._8_8_);
                    afVar137 = BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack4
                                         (local_d0,(__m128 *)local_c0,(__m128 *)local_100);
                    auVar90._0_8_ = afVar137._0_8_;
                    auVar90._8_56_ = auVar102;
                    *(undefined1 (*) [16])pfVar39 = auVar90._0_16_;
                    pfVar41 = pfVar41 + 4;
                    pfVar48 = pfVar48 + 1;
                    pfVar39 = pfVar39 + 4;
                  }
                }
                if (iVar30 == 1) {
                  uVar36 = local_140._0_8_ & 0xffffffff;
                  while (iVar35 = (int)uVar36, uVar36 = (ulong)(iVar35 - 1), iVar35 != 0) {
                    fVar51 = BinaryOp_x86_fma_functor::binary_op_ratan2::func
                                       (local_d0,pfVar41,pfVar48);
                    *pfVar39 = fVar51;
                    pfVar41 = pfVar41 + 1;
                    pfVar48 = pfVar48 + 1;
                    pfVar39 = pfVar39 + 1;
                  }
                }
                iVar35 = (int)local_128 + 1;
              }
              iVar35 = (int)local_108 + 1;
            }
            uVar25 = local_80._0_8_ + 1;
          }
          return 0;
        }
      }
      else if ((bVar18 && uVar3 == 3) && (iVar35 == 1)) {
        if (local_170->w != uVar28) {
          return 0;
        }
        if (local_170->c != uVar40) {
          return 0;
        }
        switch(uVar26) {
        case 0:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            pauVar42 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pfVar39 = (float *)((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pfVar48 = pfVar41;
              pauVar47 = pauVar42;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar77._0_4_ = *pfVar39 + *pfVar48;
                auVar77._4_4_ = pfVar39[1] + pfVar48[1];
                auVar77._8_4_ = pfVar39[2] + pfVar48[2];
                auVar77._12_4_ = pfVar39[3] + pfVar48[3];
                auVar77._16_4_ = pfVar39[4] + pfVar48[4];
                auVar77._20_4_ = pfVar39[5] + pfVar48[5];
                auVar77._24_4_ = pfVar39[6] + pfVar48[6];
                auVar77._28_4_ = pfVar39[7] + pfVar48[7];
                *pauVar47 = auVar77;
                pfVar48 = pfVar48 + 8;
                pfVar39 = pfVar39 + 8;
                pauVar47 = pauVar47 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                pfVar39 = (float *)((long)pvVar5 + lVar23 + lVar29);
                pfVar48 = (float *)((long)pfVar41 + lVar23);
                auVar55._0_4_ = *pfVar39 + *pfVar48;
                auVar55._4_4_ = pfVar39[1] + pfVar48[1];
                auVar55._8_4_ = pfVar39[2] + pfVar48[2];
                auVar55._12_4_ = pfVar39[3] + pfVar48[3];
                *(undefined1 (*) [16])((long)*pauVar42 + lVar23) = auVar55;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + lVar23);
              pfVar41 = (float *)((long)pfVar41 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                *(float *)*pauVar42 = *(float *)((long)pvVar5 + lVar22 * 4 + lVar29) + *pfVar41;
                pfVar41 = pfVar41 + 1;
                pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 4);
              }
            }
          }
          return 0;
        case 1:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pauVar45 = (undefined1 (*) [32])((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pauVar37 = pauVar42;
              pauVar49 = pauVar47;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar12 = vsubps_avx(*pauVar37,*pauVar45);
                *pauVar49 = auVar12;
                pauVar37 = pauVar37 + 1;
                pauVar45 = pauVar45 + 1;
                pauVar49 = pauVar49 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                auVar74 = vsubps_avx(*(undefined1 (*) [16])(*pauVar42 + lVar23),
                                     *(undefined1 (*) [16])((long)pvVar5 + lVar23 + lVar29));
                *(undefined1 (*) [16])((long)*pauVar47 + lVar23) = auVar74;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar23);
              pauVar42 = (undefined1 (*) [32])(*pauVar42 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                *(float *)*pauVar47 =
                     *(float *)*pauVar42 - *(float *)((long)pvVar5 + lVar22 * 4 + lVar29);
                pauVar42 = (undefined1 (*) [32])(*pauVar42 + 4);
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 2:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar25 * local_170->elemsize +
                               (long)local_170->data);
            pauVar42 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pfVar39 = (float *)((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pfVar48 = pfVar41;
              pauVar47 = pauVar42;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar17._4_4_ = pfVar39[1] * pfVar48[1];
                auVar17._0_4_ = *pfVar39 * *pfVar48;
                auVar17._8_4_ = pfVar39[2] * pfVar48[2];
                auVar17._12_4_ = pfVar39[3] * pfVar48[3];
                auVar17._16_4_ = pfVar39[4] * pfVar48[4];
                auVar17._20_4_ = pfVar39[5] * pfVar48[5];
                auVar17._24_4_ = pfVar39[6] * pfVar48[6];
                auVar17._28_4_ = pfVar39[7];
                *pauVar47 = auVar17;
                pfVar48 = pfVar48 + 8;
                pfVar39 = pfVar39 + 8;
                pauVar47 = pauVar47 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                pfVar39 = (float *)((long)pvVar5 + lVar23 + lVar29);
                pfVar48 = (float *)((long)pfVar41 + lVar23);
                auVar73._0_4_ = *pfVar39 * *pfVar48;
                auVar73._4_4_ = pfVar39[1] * pfVar48[1];
                auVar73._8_4_ = pfVar39[2] * pfVar48[2];
                auVar73._12_4_ = pfVar39[3] * pfVar48[3];
                *(undefined1 (*) [16])((long)*pauVar42 + lVar23) = auVar73;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + lVar23);
              pfVar41 = (float *)((long)pfVar41 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                *(float *)*pauVar42 = *(float *)((long)pvVar5 + lVar22 * 4 + lVar29) * *pfVar41;
                pfVar41 = pfVar41 + 1;
                pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 4);
              }
            }
          }
          return 0;
        case 3:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pauVar45 = (undefined1 (*) [32])((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pauVar37 = pauVar42;
              pauVar49 = pauVar47;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar75 = vrcpps_avx(*pauVar45);
                auVar12 = *pauVar37;
                auVar133._0_4_ = auVar12._0_4_ * auVar75._0_4_;
                auVar133._4_4_ = auVar12._4_4_ * auVar75._4_4_;
                auVar133._8_4_ = auVar12._8_4_ * auVar75._8_4_;
                auVar133._12_4_ = auVar12._12_4_ * auVar75._12_4_;
                auVar133._16_4_ = auVar12._16_4_ * auVar75._16_4_;
                auVar133._20_4_ = auVar12._20_4_ * auVar75._20_4_;
                auVar133._28_36_ = in_ZMM3._28_36_;
                auVar133._24_4_ = auVar12._24_4_ * auVar75._24_4_;
                auVar122 = auVar133._0_32_;
                in_ZMM3 = ZEXT3264(auVar122);
                auVar74 = vfmsub213ps_fma(*pauVar45,auVar122,auVar12);
                auVar74 = vfnmadd213ps_fma(ZEXT1632(auVar74),auVar75,auVar122);
                *pauVar49 = ZEXT1632(auVar74);
                pauVar37 = pauVar37 + 1;
                pauVar45 = pauVar45 + 1;
                pauVar49 = pauVar49 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                auVar74 = *(undefined1 (*) [16])(*pauVar42 + lVar23);
                auVar52 = *(undefined1 (*) [16])((long)pvVar5 + lVar23 + lVar29);
                auVar56 = vrcpps_avx(auVar52);
                auVar128._0_4_ = auVar74._0_4_ * auVar56._0_4_;
                auVar128._4_4_ = auVar74._4_4_ * auVar56._4_4_;
                auVar128._8_4_ = auVar74._8_4_ * auVar56._8_4_;
                auVar128._12_4_ = auVar74._12_4_ * auVar56._12_4_;
                in_ZMM3 = ZEXT1664(auVar128);
                auVar74 = vfmsub213ps_fma(auVar52,auVar128,auVar74);
                auVar74 = vfnmadd213ps_fma(auVar74,auVar56,auVar128);
                *(undefined1 (*) [16])((long)*pauVar47 + lVar23) = auVar74;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar23);
              pauVar42 = (undefined1 (*) [32])(*pauVar42 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                *(float *)*pauVar47 =
                     *(float *)*pauVar42 / *(float *)((long)pvVar5 + lVar22 * 4 + lVar29);
                pauVar42 = (undefined1 (*) [32])(*pauVar42 + 4);
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 4:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pauVar45 = (undefined1 (*) [32])((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pauVar37 = pauVar42;
              pauVar49 = pauVar47;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar12 = vmaxps_avx(*pauVar37,*pauVar45);
                *pauVar49 = auVar12;
                pauVar37 = pauVar37 + 1;
                pauVar45 = pauVar45 + 1;
                pauVar49 = pauVar49 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                auVar74 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar42 + lVar23),
                                     *(undefined1 (*) [16])((long)pvVar5 + lVar23 + lVar29));
                *(undefined1 (*) [16])((long)*pauVar47 + lVar23) = auVar74;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar23);
              pauVar42 = (undefined1 (*) [32])(*pauVar42 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                auVar74 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar5 + lVar22 * 4 + lVar29)),
                                     ZEXT416(*(uint *)*pauVar42));
                *(int *)*pauVar47 = auVar74._0_4_;
                pauVar42 = (undefined1 (*) [32])(*pauVar42 + 4);
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 5:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pauVar45 = (undefined1 (*) [32])((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pauVar37 = pauVar42;
              pauVar49 = pauVar47;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar12 = vminps_avx(*pauVar37,*pauVar45);
                *pauVar49 = auVar12;
                pauVar37 = pauVar37 + 1;
                pauVar45 = pauVar45 + 1;
                pauVar49 = pauVar49 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                auVar74 = vminps_avx(*(undefined1 (*) [16])(*pauVar42 + lVar23),
                                     *(undefined1 (*) [16])((long)pvVar5 + lVar23 + lVar29));
                *(undefined1 (*) [16])((long)*pauVar47 + lVar23) = auVar74;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar23);
              pauVar42 = (undefined1 (*) [32])(*pauVar42 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                auVar74 = vminss_avx(ZEXT416(*(uint *)((long)pvVar5 + lVar22 * 4 + lVar29)),
                                     ZEXT416(*(uint *)*pauVar42));
                *(int *)*pauVar47 = auVar74._0_4_;
                pauVar42 = (undefined1 (*) [32])(*pauVar42 + 4);
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 6:
          iVar30 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar28 * local_170->elempack;
          uVar36 = 0;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          local_110 = CONCAT44(local_110._4_4_,iVar30);
          local_a0._0_8_ = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            local_a0._0_8_ = uVar36;
          }
          for (; uVar36 != local_a0._0_8_; uVar36 = uVar36 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar36 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data)
            ;
            local_80._0_8_ = uVar36;
            for (iVar30 = 0; iVar30 != (uint)local_110; iVar30 = iVar30 + 1) {
              local_128 = (float *)local_160->data;
              local_108 = local_160->cstep * uVar36 * local_160->elemsize;
              pafVar38 = (__m256 *)((long)local_128 + local_108);
              lVar29 = 0;
              lVar22 = 0;
              pafVar27 = (__m256 *)local_168;
              local_118 = pfVar41;
              for (iVar35 = 0; iVar35 + 7 < (int)local_140._0_4_; iVar35 = iVar35 + 8) {
                local_c0 = *(float (*) [2])pfVar41;
                afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                afStack_b0 = *(float (*) [2])(pfVar41 + 4);
                afStack_a8 = *(float (*) [2])(pfVar41 + 6);
                local_100 = *pafVar38;
                local_120 = (void *)lVar22;
                afVar78 = local_100;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                          ((binary_op_pow *)local_d0,(__m256 *)local_c0,&local_100);
                *pafVar27 = afVar78;
                pfVar41 = pfVar41 + 8;
                pafVar38 = pafVar38 + 1;
                pafVar27 = pafVar27 + 1;
                lVar22 = (long)local_120 + 0x20;
                lVar29 = lVar29 + 8;
              }
              local_128 = (float *)((long)local_128 + local_108);
              for (; iVar35 + 3 < (int)local_140._0_4_; iVar35 = iVar35 + 4) {
                local_c0 = *(float (*) [2])((long)local_118 + lVar22);
                afStack_b8 = *(float (*) [2])((float *)((long)local_118 + lVar22) + 2);
                local_100._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar22);
                auVar102 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar22) + 8))
                ;
                afVar137 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                     ((binary_op_pow *)local_d0,(__m128 *)local_c0,
                                      (__m128 *)local_100);
                auVar96._0_8_ = afVar137._0_8_;
                auVar96._8_56_ = auVar102;
                *(undefined1 (*) [16])((long)local_168 + lVar22) = auVar96._0_16_;
                lVar22 = lVar22 + 0x10;
                lVar29 = lVar29 + 4;
              }
              local_168 = (float *)((long)local_168 + lVar22);
              pfVar41 = (float *)((long)local_118 + lVar22);
              uVar36 = local_80._0_8_;
              for (; (int)lVar29 < (int)local_140._0_4_; lVar29 = lVar29 + 1) {
                fVar51 = powf(*pfVar41,*(float *)((long)local_128 + lVar29 * 4));
                *local_168 = fVar51;
                pfVar41 = pfVar41 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        case 7:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pauVar45 = (undefined1 (*) [32])((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pauVar37 = pauVar42;
              pauVar49 = pauVar47;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar12 = vsubps_avx(*pauVar45,*pauVar37);
                *pauVar49 = auVar12;
                pauVar37 = pauVar37 + 1;
                pauVar45 = pauVar45 + 1;
                pauVar49 = pauVar49 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                auVar74 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar5 + lVar23 + lVar29),
                                     *(undefined1 (*) [16])(*pauVar42 + lVar23));
                *(undefined1 (*) [16])((long)*pauVar47 + lVar23) = auVar74;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar23);
              pauVar42 = (undefined1 (*) [32])(*pauVar42 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                *(float *)*pauVar47 =
                     *(float *)((long)pvVar5 + lVar22 * 4 + lVar29) - *(float *)*pauVar42;
                pauVar42 = (undefined1 (*) [32])(*pauVar42 + 4);
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 8:
          iVar35 = uVar28 * local_170->elempack;
          iVar30 = local_170->h;
          if (local_170->h < 1) {
            iVar30 = 0;
          }
          uVar36 = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            uVar36 = 0;
          }
          for (uVar25 = 0; uVar25 != uVar36; uVar25 = uVar25 + 1) {
            pauVar42 = (undefined1 (*) [32])
                       (local_170->cstep * uVar25 * local_170->elemsize + (long)local_170->data);
            pauVar47 = (undefined1 (*) [32])
                       (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
            for (iVar21 = 0; iVar21 != iVar30; iVar21 = iVar21 + 1) {
              pvVar5 = local_160->data;
              lVar29 = local_160->cstep * uVar25 * local_160->elemsize;
              pauVar45 = (undefined1 (*) [32])((long)pvVar5 + lVar29);
              lVar22 = 0;
              lVar23 = 0;
              pauVar37 = pauVar42;
              pauVar49 = pauVar47;
              for (iVar20 = 0; iVar20 + 7 < iVar35; iVar20 = iVar20 + 8) {
                auVar75 = vrcpps_avx(*pauVar37);
                auVar12 = *pauVar45;
                auVar134._0_4_ = auVar12._0_4_ * auVar75._0_4_;
                auVar134._4_4_ = auVar12._4_4_ * auVar75._4_4_;
                auVar134._8_4_ = auVar12._8_4_ * auVar75._8_4_;
                auVar134._12_4_ = auVar12._12_4_ * auVar75._12_4_;
                auVar134._16_4_ = auVar12._16_4_ * auVar75._16_4_;
                auVar134._20_4_ = auVar12._20_4_ * auVar75._20_4_;
                auVar134._28_36_ = in_ZMM3._28_36_;
                auVar134._24_4_ = auVar12._24_4_ * auVar75._24_4_;
                auVar122 = auVar134._0_32_;
                in_ZMM3 = ZEXT3264(auVar122);
                auVar74 = vfmsub213ps_fma(*pauVar37,auVar122,auVar12);
                auVar74 = vfnmadd213ps_fma(ZEXT1632(auVar74),auVar75,auVar122);
                *pauVar49 = ZEXT1632(auVar74);
                pauVar37 = pauVar37 + 1;
                pauVar45 = pauVar45 + 1;
                pauVar49 = pauVar49 + 1;
                lVar23 = lVar23 + 0x20;
                lVar22 = lVar22 + 8;
              }
              for (; iVar20 + 3 < iVar35; iVar20 = iVar20 + 4) {
                auVar52 = vrcpps_avx(*(undefined1 (*) [16])(*pauVar42 + lVar23));
                auVar74 = *(undefined1 (*) [16])((long)pvVar5 + lVar23 + lVar29);
                auVar129._0_4_ = auVar74._0_4_ * auVar52._0_4_;
                auVar129._4_4_ = auVar74._4_4_ * auVar52._4_4_;
                auVar129._8_4_ = auVar74._8_4_ * auVar52._8_4_;
                auVar129._12_4_ = auVar74._12_4_ * auVar52._12_4_;
                in_ZMM3 = ZEXT1664(auVar129);
                auVar74 = vfmsub213ps_fma(*(undefined1 (*) [16])(*pauVar42 + lVar23),auVar129,
                                          auVar74);
                auVar74 = vfnmadd213ps_fma(auVar74,auVar52,auVar129);
                *(undefined1 (*) [16])((long)*pauVar47 + lVar23) = auVar74;
                lVar23 = lVar23 + 0x10;
                lVar22 = lVar22 + 4;
              }
              pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + lVar23);
              pauVar42 = (undefined1 (*) [32])(*pauVar42 + lVar23);
              for (; (int)lVar22 < iVar35; lVar22 = lVar22 + 1) {
                *(float *)*pauVar47 =
                     *(float *)((long)pvVar5 + lVar22 * 4 + lVar29) / *(float *)*pauVar42;
                pauVar42 = (undefined1 (*) [32])(*pauVar42 + 4);
                pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 4);
              }
            }
          }
          return 0;
        case 9:
          iVar30 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar28 * local_170->elempack;
          uVar36 = 0;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          local_110 = CONCAT44(local_110._4_4_,iVar30);
          local_a0._0_8_ = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            local_a0._0_8_ = uVar36;
          }
          for (; uVar36 != local_a0._0_8_; uVar36 = uVar36 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar36 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data)
            ;
            local_80._0_8_ = uVar36;
            for (iVar30 = 0; iVar30 != (uint)local_110; iVar30 = iVar30 + 1) {
              local_128 = (float *)local_160->data;
              local_108 = local_160->cstep * uVar36 * local_160->elemsize;
              pafVar38 = (__m256 *)((long)local_128 + local_108);
              lVar29 = 0;
              lVar22 = 0;
              pafVar27 = (__m256 *)local_168;
              local_118 = pfVar41;
              for (iVar35 = 0; iVar35 + 7 < (int)local_140._0_4_; iVar35 = iVar35 + 8) {
                local_c0 = *(float (*) [2])pfVar41;
                afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                afStack_b0 = *(float (*) [2])(pfVar41 + 4);
                afStack_a8 = *(float (*) [2])(pfVar41 + 6);
                local_100 = *pafVar38;
                local_120 = (void *)lVar22;
                afVar78 = local_100;
                BinaryOp_x86_fma_functor::binary_op_rpow::func_pack8
                          ((binary_op_rpow *)local_d0,(__m256 *)local_c0,&local_100);
                *pafVar27 = afVar78;
                pfVar41 = pfVar41 + 8;
                pafVar38 = pafVar38 + 1;
                pafVar27 = pafVar27 + 1;
                lVar22 = (long)local_120 + 0x20;
                lVar29 = lVar29 + 8;
              }
              local_128 = (float *)((long)local_128 + local_108);
              for (; iVar35 + 3 < (int)local_140._0_4_; iVar35 = iVar35 + 4) {
                local_c0 = *(float (*) [2])((long)local_118 + lVar22);
                afStack_b8 = *(float (*) [2])((float *)((long)local_118 + lVar22) + 2);
                local_100._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar22);
                auVar102 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar22) + 8))
                ;
                afVar137 = BinaryOp_x86_fma_functor::binary_op_rpow::func_pack4
                                     ((binary_op_rpow *)local_d0,(__m128 *)local_c0,
                                      (__m128 *)local_100);
                auVar95._0_8_ = afVar137._0_8_;
                auVar95._8_56_ = auVar102;
                *(undefined1 (*) [16])((long)local_168 + lVar22) = auVar95._0_16_;
                lVar22 = lVar22 + 0x10;
                lVar29 = lVar29 + 4;
              }
              local_168 = (float *)((long)local_168 + lVar22);
              pfVar41 = (float *)((long)local_118 + lVar22);
              uVar36 = local_80._0_8_;
              for (; (int)lVar29 < (int)local_140._0_4_; lVar29 = lVar29 + 1) {
                fVar51 = powf(*(float *)((long)local_128 + lVar29 * 4),*pfVar41);
                *local_168 = fVar51;
                pfVar41 = pfVar41 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        case 10:
          iVar30 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar28 * local_170->elempack;
          uVar36 = 0;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          local_108 = CONCAT44(local_108._4_4_,iVar30);
          local_a0._0_8_ = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            local_a0._0_8_ = uVar36;
          }
          for (; uVar36 != local_a0._0_8_; uVar36 = uVar36 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar36 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data)
            ;
            local_110 = uVar36;
            for (iVar30 = 0; iVar30 != (int)local_108; iVar30 = iVar30 + 1) {
              local_120 = local_160->data;
              local_118 = (float *)(local_160->cstep * uVar36 * local_160->elemsize);
              pafVar38 = (__m256 *)((long)local_120 + (long)local_118);
              lVar29 = 0;
              pafVar27 = (__m256 *)local_168;
              local_128 = pfVar41;
              for (iVar35 = 0; pfVar39 = local_118, pvVar5 = local_120,
                  iVar35 + 7 < (int)local_140._0_4_; iVar35 = iVar35 + 8) {
                local_c0 = *(float (*) [2])pfVar41;
                afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                afStack_b0 = *(float (*) [2])(pfVar41 + 4);
                afStack_a8 = *(float (*) [2])(pfVar41 + 6);
                local_100 = *pafVar38;
                afVar78 = local_100;
                BinaryOp_x86_fma_functor::binary_op_atan2::func_pack8
                          ((binary_op_atan2 *)local_d0,(__m256 *)local_c0,&local_100);
                *pafVar27 = afVar78;
                pfVar41 = pfVar41 + 8;
                pafVar38 = pafVar38 + 1;
                pafVar27 = pafVar27 + 1;
                lVar29 = lVar29 + 0x20;
              }
              for (; uVar36 = local_110, iVar35 + 3 < (int)local_140._0_4_; iVar35 = iVar35 + 4) {
                local_c0 = *(float (*) [2])((long)local_128 + lVar29);
                afStack_b8 = *(float (*) [2])((float *)((long)local_128 + lVar29) + 2);
                pauVar1 = (undefined1 (*) [16])((long)pvVar5 + lVar29 + (long)pfVar39);
                local_100._0_16_ = *pauVar1;
                auVar102 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                afVar137 = BinaryOp_x86_fma_functor::binary_op_atan2::func_pack4
                                     ((binary_op_atan2 *)local_d0,(__m128 *)local_c0,
                                      (__m128 *)local_100);
                auVar97._0_8_ = afVar137._0_8_;
                auVar97._8_56_ = auVar102;
                *(undefined1 (*) [16])((long)local_168 + lVar29) = auVar97._0_16_;
                lVar29 = lVar29 + 0x10;
              }
              local_168 = (float *)((long)local_168 + lVar29);
              pfVar39 = (float *)((long)local_120 + (long)local_118 + lVar29);
              pfVar41 = (float *)((long)local_128 + lVar29);
              for (; iVar35 < (int)local_140._0_4_; iVar35 = iVar35 + 1) {
                fVar51 = BinaryOp_x86_fma_functor::binary_op_atan2::func
                                   ((binary_op_atan2 *)local_d0,pfVar41,pfVar39);
                *local_168 = fVar51;
                pfVar41 = pfVar41 + 1;
                pfVar39 = pfVar39 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        case 0xb:
          iVar30 = local_170->h;
          local_140._4_4_ = 0;
          local_140._0_4_ = uVar28 * local_170->elempack;
          uVar36 = 0;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          local_108 = CONCAT44(local_108._4_4_,iVar30);
          local_a0._0_8_ = (ulong)uVar40;
          if ((int)uVar40 < 1) {
            local_a0._0_8_ = uVar36;
          }
          for (; uVar36 != local_a0._0_8_; uVar36 = uVar36 + 1) {
            pfVar41 = (float *)(local_170->cstep * uVar36 * local_170->elemsize +
                               (long)local_170->data);
            local_168 = (float *)(this_00->cstep * uVar36 * this_00->elemsize + (long)this_00->data)
            ;
            local_110 = uVar36;
            for (iVar30 = 0; iVar30 != (int)local_108; iVar30 = iVar30 + 1) {
              local_120 = local_160->data;
              local_118 = (float *)(local_160->cstep * uVar36 * local_160->elemsize);
              pafVar38 = (__m256 *)((long)local_120 + (long)local_118);
              lVar29 = 0;
              pafVar27 = (__m256 *)local_168;
              local_128 = pfVar41;
              for (iVar35 = 0; pfVar39 = local_118, pvVar5 = local_120,
                  iVar35 + 7 < (int)local_140._0_4_; iVar35 = iVar35 + 8) {
                local_c0 = *(float (*) [2])pfVar41;
                afStack_b8 = *(float (*) [2])(pfVar41 + 2);
                afStack_b0 = *(float (*) [2])(pfVar41 + 4);
                afStack_a8 = *(float (*) [2])(pfVar41 + 6);
                local_100 = *pafVar38;
                afVar78 = local_100;
                BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack8
                          (local_d0,(__m256 *)local_c0,&local_100);
                *pafVar27 = afVar78;
                pfVar41 = pfVar41 + 8;
                pafVar38 = pafVar38 + 1;
                pafVar27 = pafVar27 + 1;
                lVar29 = lVar29 + 0x20;
              }
              for (; uVar36 = local_110, iVar35 + 3 < (int)local_140._0_4_; iVar35 = iVar35 + 4) {
                local_c0 = *(float (*) [2])((long)local_128 + lVar29);
                afStack_b8 = *(float (*) [2])((float *)((long)local_128 + lVar29) + 2);
                pauVar1 = (undefined1 (*) [16])((long)pvVar5 + lVar29 + (long)pfVar39);
                local_100._0_16_ = *pauVar1;
                auVar102 = ZEXT856(*(ulong *)(*pauVar1 + 8));
                afVar137 = BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack4
                                     (local_d0,(__m128 *)local_c0,(__m128 *)local_100);
                auVar94._0_8_ = afVar137._0_8_;
                auVar94._8_56_ = auVar102;
                *(undefined1 (*) [16])((long)local_168 + lVar29) = auVar94._0_16_;
                lVar29 = lVar29 + 0x10;
              }
              local_168 = (float *)((long)local_168 + lVar29);
              pfVar39 = (float *)((long)local_120 + (long)local_118 + lVar29);
              pfVar41 = (float *)((long)local_128 + lVar29);
              for (; iVar35 < (int)local_140._0_4_; iVar35 = iVar35 + 1) {
                fVar51 = BinaryOp_x86_fma_functor::binary_op_ratan2::func(local_d0,pfVar41,pfVar39);
                *local_168 = fVar51;
                pfVar41 = pfVar41 + 1;
                pfVar39 = pfVar39 + 1;
                local_168 = local_168 + 1;
              }
            }
          }
          break;
        default:
          return 0;
        }
      }
      goto switchD_0035cf79_default;
    }
    switch(uVar26) {
    case 0:
      iVar20 = iVar20 * iVar30;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
        lVar29 = local_160->elemsize * local_160->cstep * uVar36;
        pvVar5 = local_160->data;
        lVar23 = this_00->elemsize * this_00->cstep * uVar36;
        pvVar8 = this_00->data;
        lVar22 = local_170->elemsize * local_170->cstep * uVar36;
        pvVar11 = local_170->data;
        lVar32 = 0;
        lVar34 = 0;
        for (iVar30 = 0; iVar30 + 7 < iVar20; iVar30 = iVar30 + 8) {
          pfVar41 = (float *)((long)pvVar5 + lVar34 + lVar29);
          pfVar39 = (float *)((long)pvVar11 + lVar34 + lVar22);
          auVar75._0_4_ = *pfVar41 + *pfVar39;
          auVar75._4_4_ = pfVar41[1] + pfVar39[1];
          auVar75._8_4_ = pfVar41[2] + pfVar39[2];
          auVar75._12_4_ = pfVar41[3] + pfVar39[3];
          auVar75._16_4_ = pfVar41[4] + pfVar39[4];
          auVar75._20_4_ = pfVar41[5] + pfVar39[5];
          auVar75._24_4_ = pfVar41[6] + pfVar39[6];
          auVar75._28_4_ = pfVar41[7] + pfVar39[7];
          *(undefined1 (*) [32])((long)pvVar8 + lVar34 + lVar23) = auVar75;
          lVar34 = lVar34 + 0x20;
          lVar32 = lVar32 + 8;
        }
        for (; iVar30 + 3 < iVar20; iVar30 = iVar30 + 4) {
          pfVar41 = (float *)((long)pvVar5 + lVar34 + lVar29);
          pfVar39 = (float *)((long)pvVar11 + lVar34 + lVar22);
          auVar52._0_4_ = *pfVar41 + *pfVar39;
          auVar52._4_4_ = pfVar41[1] + pfVar39[1];
          auVar52._8_4_ = pfVar41[2] + pfVar39[2];
          auVar52._12_4_ = pfVar41[3] + pfVar39[3];
          *(undefined1 (*) [16])((long)pvVar8 + lVar34 + lVar23) = auVar52;
          lVar34 = lVar34 + 0x10;
          lVar32 = lVar32 + 4;
        }
        for (; (int)lVar32 < iVar20; lVar32 = lVar32 + 1) {
          *(float *)((long)pvVar8 + lVar32 * 4 + lVar23) =
               *(float *)((long)pvVar5 + lVar32 * 4 + lVar29) +
               *(float *)((long)pvVar11 + lVar32 * 4 + lVar22);
        }
      }
      return 0;
    case 1:
      pMVar31 = local_160;
      local_160 = local_170;
      break;
    case 2:
      iVar20 = iVar20 * iVar30;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
        lVar29 = local_160->elemsize * local_160->cstep * uVar36;
        pvVar5 = local_160->data;
        lVar23 = this_00->elemsize * this_00->cstep * uVar36;
        pvVar8 = this_00->data;
        lVar22 = local_170->elemsize * local_170->cstep * uVar36;
        pvVar11 = local_170->data;
        lVar32 = 0;
        lVar34 = 0;
        for (iVar30 = 0; iVar30 + 7 < iVar20; iVar30 = iVar30 + 8) {
          pfVar41 = (float *)((long)pvVar5 + lVar34 + lVar29);
          pfVar39 = (float *)((long)pvVar11 + lVar34 + lVar22);
          auVar12._4_4_ = pfVar41[1] * pfVar39[1];
          auVar12._0_4_ = *pfVar41 * *pfVar39;
          auVar12._8_4_ = pfVar41[2] * pfVar39[2];
          auVar12._12_4_ = pfVar41[3] * pfVar39[3];
          auVar12._16_4_ = pfVar41[4] * pfVar39[4];
          auVar12._20_4_ = pfVar41[5] * pfVar39[5];
          auVar12._24_4_ = pfVar41[6] * pfVar39[6];
          auVar12._28_4_ = pfVar41[7];
          *(undefined1 (*) [32])((long)pvVar8 + lVar34 + lVar23) = auVar12;
          lVar34 = lVar34 + 0x20;
          lVar32 = lVar32 + 8;
        }
        for (; iVar30 + 3 < iVar20; iVar30 = iVar30 + 4) {
          pfVar41 = (float *)((long)pvVar5 + lVar34 + lVar29);
          pfVar39 = (float *)((long)pvVar11 + lVar34 + lVar22);
          auVar74._0_4_ = *pfVar41 * *pfVar39;
          auVar74._4_4_ = pfVar41[1] * pfVar39[1];
          auVar74._8_4_ = pfVar41[2] * pfVar39[2];
          auVar74._12_4_ = pfVar41[3] * pfVar39[3];
          *(undefined1 (*) [16])((long)pvVar8 + lVar34 + lVar23) = auVar74;
          lVar34 = lVar34 + 0x10;
          lVar32 = lVar32 + 4;
        }
        for (; (int)lVar32 < iVar20; lVar32 = lVar32 + 1) {
          *(float *)((long)pvVar8 + lVar32 * 4 + lVar23) =
               *(float *)((long)pvVar5 + lVar32 * 4 + lVar29) *
               *(float *)((long)pvVar11 + lVar32 * 4 + lVar22);
        }
      }
      return 0;
    case 3:
      pMVar31 = local_160;
      local_160 = local_170;
      goto LAB_00361ae2;
    case 4:
      iVar20 = iVar20 * iVar30;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
        lVar29 = local_160->elemsize * local_160->cstep * uVar36;
        pvVar5 = local_160->data;
        lVar23 = this_00->elemsize * this_00->cstep * uVar36;
        pvVar8 = this_00->data;
        lVar22 = local_170->elemsize * local_170->cstep * uVar36;
        pvVar11 = local_170->data;
        lVar32 = 0;
        lVar34 = 0;
        for (iVar30 = 0; iVar30 + 7 < iVar20; iVar30 = iVar30 + 8) {
          auVar12 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar11 + lVar34 + lVar22),
                               *(undefined1 (*) [32])((long)pvVar5 + lVar34 + lVar29));
          *(undefined1 (*) [32])((long)pvVar8 + lVar34 + lVar23) = auVar12;
          lVar34 = lVar34 + 0x20;
          lVar32 = lVar32 + 8;
        }
        for (; iVar30 + 3 < iVar20; iVar30 = iVar30 + 4) {
          auVar74 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar34 + lVar22),
                               *(undefined1 (*) [16])((long)pvVar5 + lVar34 + lVar29));
          *(undefined1 (*) [16])((long)pvVar8 + lVar34 + lVar23) = auVar74;
          lVar34 = lVar34 + 0x10;
          lVar32 = lVar32 + 4;
        }
        for (; (int)lVar32 < iVar20; lVar32 = lVar32 + 1) {
          auVar74 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar5 + lVar32 * 4 + lVar29)),
                               ZEXT416(*(uint *)((long)pvVar11 + lVar32 * 4 + lVar22)));
          *(int *)((long)pvVar8 + lVar32 * 4 + lVar23) = auVar74._0_4_;
        }
      }
      return 0;
    case 5:
      iVar20 = iVar20 * iVar30;
      if ((int)uVar40 < 1) {
        uVar40 = 0;
      }
      for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
        lVar29 = local_160->elemsize * local_160->cstep * uVar36;
        pvVar5 = local_160->data;
        lVar23 = this_00->elemsize * this_00->cstep * uVar36;
        pvVar8 = this_00->data;
        lVar22 = local_170->elemsize * local_170->cstep * uVar36;
        pvVar11 = local_170->data;
        lVar32 = 0;
        lVar34 = 0;
        for (iVar30 = 0; iVar30 + 7 < iVar20; iVar30 = iVar30 + 8) {
          auVar12 = vminps_avx(*(undefined1 (*) [32])((long)pvVar11 + lVar34 + lVar22),
                               *(undefined1 (*) [32])((long)pvVar5 + lVar34 + lVar29));
          *(undefined1 (*) [32])((long)pvVar8 + lVar34 + lVar23) = auVar12;
          lVar34 = lVar34 + 0x20;
          lVar32 = lVar32 + 8;
        }
        for (; iVar30 + 3 < iVar20; iVar30 = iVar30 + 4) {
          auVar74 = vminps_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar34 + lVar22),
                               *(undefined1 (*) [16])((long)pvVar5 + lVar34 + lVar29));
          *(undefined1 (*) [16])((long)pvVar8 + lVar34 + lVar23) = auVar74;
          lVar34 = lVar34 + 0x10;
          lVar32 = lVar32 + 4;
        }
        for (; (int)lVar32 < iVar20; lVar32 = lVar32 + 1) {
          auVar74 = vminss_avx(ZEXT416(*(uint *)((long)pvVar5 + lVar32 * 4 + lVar29)),
                               ZEXT416(*(uint *)((long)pvVar11 + lVar32 * 4 + lVar22)));
          *(int *)((long)pvVar8 + lVar32 * 4 + lVar23) = auVar74._0_4_;
        }
      }
      return 0;
    case 6:
      pMVar31 = local_160;
      local_160 = local_170;
      goto LAB_00361ac0;
    case 7:
      pMVar31 = local_170;
      break;
    case 8:
      pMVar31 = local_170;
LAB_00361ae2:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
                (local_160,pMVar31,this_00,(Option *)&switchD_0035cf79::switchdataD_004f43cc);
      return 0;
    case 9:
      pMVar31 = local_170;
LAB_00361ac0:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                (local_160,pMVar31,this_00,(Option *)&switchD_0035cf79::switchdataD_004f43cc);
      return 0;
    case 10:
      pMVar31 = local_160;
      local_160 = local_170;
      goto LAB_00361b04;
    case 0xb:
      pMVar31 = local_170;
LAB_00361b04:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_atan2>
                (local_160,pMVar31,this_00,(Option *)&switchD_0035cf79::switchdataD_004f43cc);
      return 0;
    default:
      goto switchD_0035cf79_default;
    }
    binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>
              (local_160,pMVar31,this_00,(Option *)&switchD_0035cf79::switchdataD_004f43cc);
    return 0;
  }
  if (0xb < uVar26) goto switchD_0035cf79_default;
  fVar51 = *local_160->data;
  local_140 = ZEXT416((uint)fVar51);
  auVar74 = ZEXT416((uint)fVar51);
  auVar52 = ZEXT416((uint)fVar51);
  switch(uVar26) {
  case 0:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar52,auVar74,0);
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pfVar41 = (float *)(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      iVar35 = 0;
      while( true ) {
        fVar50 = auVar74._0_4_;
        fVar98 = auVar74._4_4_;
        fVar99 = auVar74._8_4_;
        fVar103 = auVar74._12_4_;
        if (iVar30 <= iVar35 + 7) break;
        auVar121._0_4_ = fVar50 + *pfVar41;
        auVar121._4_4_ = fVar98 + pfVar41[1];
        auVar121._8_4_ = fVar99 + pfVar41[2];
        auVar121._12_4_ = fVar103 + pfVar41[3];
        auVar121._16_4_ = fVar50 + pfVar41[4];
        auVar121._20_4_ = fVar98 + pfVar41[5];
        auVar121._24_4_ = fVar99 + pfVar41[6];
        auVar121._28_4_ = fVar103 + pfVar41[7];
        *pauVar42 = auVar121;
        pfVar41 = pfVar41 + 8;
        pauVar42 = pauVar42 + 1;
        iVar35 = iVar35 + 8;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar117._0_4_ = fVar50 + *pfVar41;
        auVar117._4_4_ = fVar98 + pfVar41[1];
        auVar117._8_4_ = fVar99 + pfVar41[2];
        auVar117._12_4_ = fVar103 + pfVar41[3];
        *(undefined1 (*) [16])*pauVar42 = auVar117;
        pfVar41 = pfVar41 + 4;
        pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        *(float *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) =
             fVar51 + *(float *)((long)pvVar5 + lVar29 * 4 + sVar7 * sVar6 * uVar36);
      }
    }
    break;
  case 1:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar52,0);
    auVar112._16_16_ = auVar74;
    auVar112._0_16_ = auVar74;
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        auVar12 = vsubps_avx(*pauVar42,auVar112);
        *pauVar47 = auVar12;
        pauVar42 = pauVar42 + 1;
        pauVar47 = pauVar47 + 1;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar52 = vsubps_avx(*(undefined1 (*) [16])*pauVar42,auVar74);
        *(undefined1 (*) [16])*pauVar47 = auVar52;
        pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
        pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        *(float *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) =
             *(float *)((long)pvVar5 + lVar29 * 4 + sVar7 * sVar6 * uVar36) - fVar51;
      }
    }
    break;
  case 2:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pfVar41 = (float *)(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      iVar35 = 0;
      while( true ) {
        fVar50 = auVar74._0_4_;
        fVar98 = auVar74._4_4_;
        fVar99 = auVar74._8_4_;
        if (iVar30 <= iVar35 + 7) break;
        auVar124._0_4_ = fVar50 * *pfVar41;
        auVar124._4_4_ = fVar98 * pfVar41[1];
        auVar124._8_4_ = fVar99 * pfVar41[2];
        auVar124._12_4_ = auVar74._12_4_ * pfVar41[3];
        auVar124._16_4_ = fVar50 * pfVar41[4];
        auVar124._20_4_ = fVar98 * pfVar41[5];
        auVar124._28_36_ = in_ZMM2._28_36_;
        auVar124._24_4_ = fVar99 * pfVar41[6];
        in_ZMM2 = ZEXT3264(auVar124._0_32_);
        *pauVar42 = auVar124._0_32_;
        pfVar41 = pfVar41 + 8;
        pauVar42 = pauVar42 + 1;
        iVar35 = iVar35 + 8;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar118._0_4_ = fVar50 * *pfVar41;
        auVar118._4_4_ = fVar98 * pfVar41[1];
        auVar118._8_4_ = fVar99 * pfVar41[2];
        auVar118._12_4_ = auVar74._12_4_ * pfVar41[3];
        in_ZMM2 = ZEXT1664(auVar118);
        *(undefined1 (*) [16])*pauVar42 = auVar118;
        pfVar41 = pfVar41 + 4;
        pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        fVar50 = fVar51 * *(float *)((long)pvVar5 + lVar29 * 4 + sVar7 * sVar6 * uVar36);
        in_ZMM2 = ZEXT464((uint)fVar50);
        *(float *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) = fVar50;
      }
    }
    break;
  case 3:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar54._0_4_ = 1.0 / fVar51;
    auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar74 = vshufps_avx(auVar54,auVar54,0);
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pfVar41 = (float *)(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      iVar35 = 0;
      while( true ) {
        fVar51 = auVar74._0_4_;
        fVar50 = auVar74._4_4_;
        fVar98 = auVar74._8_4_;
        if (iVar30 <= iVar35 + 7) break;
        auVar130._0_4_ = fVar51 * *pfVar41;
        auVar130._4_4_ = fVar50 * pfVar41[1];
        auVar130._8_4_ = fVar98 * pfVar41[2];
        auVar130._12_4_ = auVar74._12_4_ * pfVar41[3];
        auVar130._16_4_ = fVar51 * pfVar41[4];
        auVar130._20_4_ = fVar50 * pfVar41[5];
        auVar130._28_36_ = in_ZMM3._28_36_;
        auVar130._24_4_ = fVar98 * pfVar41[6];
        in_ZMM3 = ZEXT3264(auVar130._0_32_);
        *pauVar42 = auVar130._0_32_;
        pfVar41 = pfVar41 + 8;
        pauVar42 = pauVar42 + 1;
        iVar35 = iVar35 + 8;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar125._0_4_ = fVar51 * *pfVar41;
        auVar125._4_4_ = fVar50 * pfVar41[1];
        auVar125._8_4_ = fVar98 * pfVar41[2];
        auVar125._12_4_ = auVar74._12_4_ * pfVar41[3];
        in_ZMM3 = ZEXT1664(auVar125);
        *(undefined1 (*) [16])*pauVar42 = auVar125;
        pfVar41 = pfVar41 + 4;
        pauVar42 = (undefined1 (*) [32])((long)*pauVar42 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        fVar51 = auVar54._0_4_ * *(float *)((long)pvVar5 + lVar29 * 4 + sVar7 * sVar6 * uVar36);
        in_ZMM3 = ZEXT464((uint)fVar51);
        *(float *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) = fVar51;
      }
    }
    break;
  case 4:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar52 = vshufps_avx(auVar52,auVar52,0);
    auVar110._16_16_ = auVar52;
    auVar110._0_16_ = auVar52;
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        auVar12 = vmaxps_avx(auVar110,*pauVar42);
        *pauVar47 = auVar12;
        pauVar42 = pauVar42 + 1;
        pauVar47 = pauVar47 + 1;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar56 = vmaxps_avx(auVar52,*(undefined1 (*) [16])*pauVar42);
        *(undefined1 (*) [16])*pauVar47 = auVar56;
        pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
        pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        auVar56 = vmaxss_avx(auVar74,ZEXT416(*(uint *)((long)pvVar5 +
                                                      lVar29 * 4 + sVar7 * sVar6 * uVar36)));
        *(int *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) = auVar56._0_4_;
      }
    }
    break;
  case 5:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar52,0);
    auVar113._16_16_ = auVar74;
    auVar113._0_16_ = auVar74;
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        auVar12 = vminps_avx(auVar113,*pauVar42);
        *pauVar47 = auVar12;
        pauVar42 = pauVar42 + 1;
        pauVar47 = pauVar47 + 1;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar56 = vminps_avx(auVar74,*(undefined1 (*) [16])*pauVar42);
        *(undefined1 (*) [16])*pauVar47 = auVar56;
        pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
        pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        auVar56 = vminss_avx(auVar52,ZEXT416(*(uint *)((long)pvVar5 +
                                                      lVar29 * 4 + sVar7 * sVar6 * uVar36)));
        *(int *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) = auVar56._0_4_;
      }
    }
    break;
  case 6:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    local_80 = ZEXT1632(auVar74);
    register0x00001210 = auVar74;
    local_a0 = auVar74;
    uVar36 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar36;
    }
    for (; auVar12 = _local_a0, uVar36 != local_110; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar41 = (float *)((long)local_120 * uVar36 * (long)local_118 + (long)pvVar5);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar6 = this_00->cstep;
      puVar46 = (undefined8 *)(sVar6 * uVar36 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar29 = 0;
      _local_a0 = auVar12;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        uVar101 = *(undefined8 *)pfVar41;
        uVar100 = *(undefined8 *)(pfVar41 + 2);
        uVar104 = *(undefined8 *)(pfVar41 + 4);
        uVar105 = *(undefined8 *)(pfVar41 + 6);
        local_100 = *(__m256 *)pfVar41;
        BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                  ((binary_op_pow *)&local_141,&local_100,(__m256 *)local_c0);
        *puVar46 = uVar101;
        puVar46[1] = uVar100;
        puVar46[2] = uVar104;
        puVar46[3] = uVar105;
        pfVar41 = pfVar41 + 8;
        puVar46 = puVar46 + 4;
        lVar29 = lVar29 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar39 = local_128, iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar41;
        uVar101 = *(undefined8 *)(pfVar41 + 2);
        afStack_c8 = (float  [2])uVar101;
        afVar137 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                             ((binary_op_pow *)&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar46 = afVar137._0_8_;
        puVar46[1] = uVar101;
        pfVar41 = pfVar41 + 4;
        puVar46 = puVar46 + 2;
        lVar29 = lVar29 + 4;
      }
      lVar22 = (long)local_120 * (long)local_118;
      lVar23 = sVar6 * local_108;
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        fVar51 = powf(*(float *)((long)pvVar5 + lVar29 * 4 + lVar22 * uVar36),local_140._0_4_);
        *(float *)((long)pfVar39 + lVar29 * 4 + lVar23 * uVar36) = fVar51;
      }
    }
    goto switchD_0035cf79_default;
  case 7:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    auVar111._16_16_ = auVar74;
    auVar111._0_16_ = auVar74;
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        auVar12 = vsubps_avx(auVar111,*pauVar42);
        *pauVar47 = auVar12;
        pauVar42 = pauVar42 + 1;
        pauVar47 = pauVar47 + 1;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar52 = vsubps_avx(auVar74,*(undefined1 (*) [16])*pauVar42);
        *(undefined1 (*) [16])*pauVar47 = auVar52;
        pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
        pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        *(float *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) =
             fVar51 - *(float *)((long)pvVar5 + lVar29 * 4 + sVar7 * sVar6 * uVar36);
      }
    }
    break;
  case 8:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    auVar114._16_16_ = auVar74;
    auVar114._0_16_ = auVar74;
    uVar26 = local_170->c;
    if (local_170->c < 1) {
      uVar26 = 0;
    }
    for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      sVar6 = local_170->elemsize;
      sVar7 = local_170->cstep;
      pauVar42 = (undefined1 (*) [32])(sVar7 * uVar36 * sVar6 + (long)pvVar5);
      pvVar8 = this_00->data;
      sVar9 = this_00->elemsize;
      sVar10 = this_00->cstep;
      pauVar47 = (undefined1 (*) [32])(sVar10 * uVar36 * sVar9 + (long)pvVar8);
      lVar29 = 0;
      iVar35 = 0;
      while( true ) {
        fVar50 = auVar74._0_4_;
        fVar98 = auVar74._4_4_;
        fVar99 = auVar74._8_4_;
        if (iVar30 <= iVar35 + 7) break;
        auVar12 = vrcpps_avx(*pauVar42);
        auVar136._0_4_ = fVar50 * auVar12._0_4_;
        auVar136._4_4_ = fVar98 * auVar12._4_4_;
        auVar136._8_4_ = fVar99 * auVar12._8_4_;
        auVar136._12_4_ = auVar74._12_4_ * auVar12._12_4_;
        auVar136._16_4_ = fVar50 * auVar12._16_4_;
        auVar136._20_4_ = fVar98 * auVar12._20_4_;
        auVar136._28_36_ = in_ZMM4._28_36_;
        auVar136._24_4_ = fVar99 * auVar12._24_4_;
        auVar75 = auVar136._0_32_;
        in_ZMM4 = ZEXT3264(auVar75);
        auVar52 = vfmsub213ps_fma(*pauVar42,auVar75,auVar114);
        auVar52 = vfnmadd213ps_fma(ZEXT1632(auVar52),auVar12,auVar75);
        *pauVar47 = ZEXT1632(auVar52);
        pauVar42 = pauVar42 + 1;
        pauVar47 = pauVar47 + 1;
        iVar35 = iVar35 + 8;
        lVar29 = lVar29 + 8;
      }
      for (; iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        auVar52 = vrcpps_avx(*(undefined1 (*) [16])*pauVar42);
        auVar135._0_4_ = fVar50 * auVar52._0_4_;
        auVar135._4_4_ = fVar98 * auVar52._4_4_;
        auVar135._8_4_ = fVar99 * auVar52._8_4_;
        auVar135._12_4_ = auVar74._12_4_ * auVar52._12_4_;
        in_ZMM4 = ZEXT1664(auVar135);
        auVar56 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar42,auVar135,auVar74);
        auVar52 = vfnmadd213ps_fma(auVar56,auVar52,auVar135);
        *(undefined1 (*) [16])*pauVar47 = auVar52;
        pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
        pauVar47 = (undefined1 (*) [32])((long)*pauVar47 + 0x10);
        lVar29 = lVar29 + 4;
      }
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        *(float *)((long)pvVar8 + lVar29 * 4 + sVar10 * sVar9 * uVar36) =
             fVar51 / *(float *)((long)pvVar5 + lVar29 * 4 + sVar7 * sVar6 * uVar36);
      }
    }
    break;
  case 9:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    local_80 = ZEXT1632(auVar74);
    register0x00001210 = auVar74;
    local_a0 = auVar74;
    uVar36 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar36;
    }
    for (; auVar12 = _local_a0, uVar36 != local_110; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar41 = (float *)((long)local_120 * uVar36 * (long)local_118 + (long)pvVar5);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar6 = this_00->cstep;
      puVar46 = (undefined8 *)(sVar6 * uVar36 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar29 = 0;
      _local_a0 = auVar12;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        uVar101 = *(undefined8 *)pfVar41;
        uVar100 = *(undefined8 *)(pfVar41 + 2);
        uVar104 = *(undefined8 *)(pfVar41 + 4);
        uVar105 = *(undefined8 *)(pfVar41 + 6);
        local_100 = *(__m256 *)pfVar41;
        BinaryOp_x86_fma_functor::binary_op_rpow::func_pack8
                  ((binary_op_rpow *)&local_141,&local_100,(__m256 *)local_c0);
        *puVar46 = uVar101;
        puVar46[1] = uVar100;
        puVar46[2] = uVar104;
        puVar46[3] = uVar105;
        pfVar41 = pfVar41 + 8;
        puVar46 = puVar46 + 4;
        lVar29 = lVar29 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar39 = local_128, iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar41;
        uVar101 = *(undefined8 *)(pfVar41 + 2);
        afStack_c8 = (float  [2])uVar101;
        afVar137 = BinaryOp_x86_fma_functor::binary_op_rpow::func_pack4
                             ((binary_op_rpow *)&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar46 = afVar137._0_8_;
        puVar46[1] = uVar101;
        pfVar41 = pfVar41 + 4;
        puVar46 = puVar46 + 2;
        lVar29 = lVar29 + 4;
      }
      lVar22 = (long)local_120 * (long)local_118;
      lVar23 = sVar6 * local_108;
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        fVar51 = powf((float)local_140._0_4_,*(float *)((long)pvVar5 + lVar29 * 4 + lVar22 * uVar36)
                     );
        *(float *)((long)pfVar39 + lVar29 * 4 + lVar23 * uVar36) = fVar51;
      }
    }
    goto switchD_0035cf79_default;
  case 10:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    local_80 = ZEXT1632(auVar74);
    register0x00001210 = auVar74;
    local_a0 = auVar74;
    uVar36 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar36;
    }
    for (; auVar12 = _local_a0, uVar36 != local_110; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar41 = (float *)((long)local_120 * uVar36 * (long)local_118 + (long)pvVar5);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar6 = this_00->cstep;
      puVar46 = (undefined8 *)(sVar6 * uVar36 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar29 = 0;
      _local_a0 = auVar12;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        uVar101 = *(undefined8 *)pfVar41;
        uVar100 = *(undefined8 *)(pfVar41 + 2);
        uVar104 = *(undefined8 *)(pfVar41 + 4);
        uVar105 = *(undefined8 *)(pfVar41 + 6);
        local_100 = *(__m256 *)pfVar41;
        BinaryOp_x86_fma_functor::binary_op_atan2::func_pack8
                  ((binary_op_atan2 *)&local_141,&local_100,(__m256 *)local_c0);
        *puVar46 = uVar101;
        puVar46[1] = uVar100;
        puVar46[2] = uVar104;
        puVar46[3] = uVar105;
        pfVar41 = pfVar41 + 8;
        puVar46 = puVar46 + 4;
        lVar29 = lVar29 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar39 = local_128, iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar41;
        uVar101 = *(undefined8 *)(pfVar41 + 2);
        afStack_c8 = (float  [2])uVar101;
        afVar137 = BinaryOp_x86_fma_functor::binary_op_atan2::func_pack4
                             ((binary_op_atan2 *)&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar46 = afVar137._0_8_;
        puVar46[1] = uVar101;
        pfVar41 = pfVar41 + 4;
        puVar46 = puVar46 + 2;
        lVar29 = lVar29 + 4;
      }
      lVar22 = (long)local_120 * (long)local_118;
      lVar23 = sVar6 * local_108;
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        fVar51 = atan2f(*(float *)((long)pvVar5 + lVar29 * 4 + lVar22 * uVar36),local_140._0_4_);
        *(float *)((long)pfVar39 + lVar29 * 4 + lVar23 * uVar36) = fVar51;
      }
    }
    goto switchD_0035cf79_default;
  case 0xb:
    iVar30 = local_170->h * local_170->w * local_170->d * local_170->elempack;
    auVar74 = vshufps_avx(local_140,auVar74,0);
    local_80 = ZEXT1632(auVar74);
    register0x00001210 = auVar74;
    local_a0 = auVar74;
    uVar36 = 0;
    local_110 = (ulong)(uint)local_170->c;
    if (local_170->c < 1) {
      local_110 = uVar36;
    }
    for (; auVar12 = _local_a0, uVar36 != local_110; uVar36 = uVar36 + 1) {
      pvVar5 = local_170->data;
      local_118 = (float *)local_170->elemsize;
      local_120 = (void *)local_170->cstep;
      pfVar41 = (float *)((long)local_120 * uVar36 * (long)local_118 + (long)pvVar5);
      local_128 = (float *)this_00->data;
      local_108 = this_00->elemsize;
      sVar6 = this_00->cstep;
      puVar46 = (undefined8 *)(sVar6 * uVar36 * local_108 + (long)local_128);
      local_c0[0] = (float)local_a0._0_4_;
      local_c0[1] = (float)local_a0._4_4_;
      afStack_b8[0] = (float)local_a0._8_4_;
      afStack_b8[1] = (float)local_a0._12_4_;
      afStack_b0[0] = afStack_90[0];
      afStack_b0[1] = afStack_90[1];
      afStack_a8[0] = afStack_88[0];
      afStack_a8[1] = afStack_88[1];
      lVar29 = 0;
      _local_a0 = auVar12;
      for (iVar35 = 0; iVar35 + 7 < iVar30; iVar35 = iVar35 + 8) {
        uVar101 = *(undefined8 *)pfVar41;
        uVar100 = *(undefined8 *)(pfVar41 + 2);
        uVar104 = *(undefined8 *)(pfVar41 + 4);
        uVar105 = *(undefined8 *)(pfVar41 + 6);
        local_100 = *(__m256 *)pfVar41;
        BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack8
                  (&local_141,&local_100,(__m256 *)local_c0);
        *puVar46 = uVar101;
        puVar46[1] = uVar100;
        puVar46[2] = uVar104;
        puVar46[3] = uVar105;
        pfVar41 = pfVar41 + 8;
        puVar46 = puVar46 + 4;
        lVar29 = lVar29 + 8;
      }
      local_100._0_16_ = local_80._0_16_;
      for (; pfVar39 = local_128, iVar35 + 3 < iVar30; iVar35 = iVar35 + 4) {
        local_d0 = *(binary_op_ratan2 (*) [8])pfVar41;
        uVar101 = *(undefined8 *)(pfVar41 + 2);
        afStack_c8 = (float  [2])uVar101;
        afVar137 = BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack4
                             (&local_141,(__m128 *)local_d0,(__m128 *)local_100);
        *puVar46 = afVar137._0_8_;
        puVar46[1] = uVar101;
        pfVar41 = pfVar41 + 4;
        puVar46 = puVar46 + 2;
        lVar29 = lVar29 + 4;
      }
      lVar22 = (long)local_120 * (long)local_118;
      lVar23 = sVar6 * local_108;
      for (; (int)lVar29 < iVar30; lVar29 = lVar29 + 1) {
        fVar51 = atan2f((float)local_140._0_4_,
                        *(float *)((long)pvVar5 + lVar29 * 4 + lVar22 * uVar36));
        *(float *)((long)pfVar39 + lVar29 * 4 + lVar23 * uVar36) = fVar51;
      }
    }
switchD_0035cf79_default:
  }
  return 0;
}

Assistant:

int BinaryOp_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}